

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<4,4>::
     intersect_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  float *pfVar5;
  float fVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  ulong uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [12];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  byte bVar54;
  byte bVar55;
  ulong uVar56;
  byte bVar57;
  long lVar58;
  byte bVar59;
  long lVar60;
  bool bVar61;
  undefined1 uVar62;
  undefined1 uVar63;
  ulong uVar64;
  uint uVar65;
  uint uVar132;
  uint uVar133;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  uint uVar135;
  uint uVar136;
  uint uVar137;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  uint uVar134;
  uint uVar138;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  vint4 bi_2;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  float fVar153;
  undefined4 uVar154;
  float fVar155;
  float fVar171;
  float fVar172;
  vint4 bi_1;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar167 [32];
  undefined1 auVar158 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  vint4 bi;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  vint4 ai;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar225 [32];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [64];
  vint4 ai_1;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  vint4 ai_2;
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [64];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [64];
  undefined4 uVar246;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined4 uVar247;
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_a18;
  undefined1 local_a00 [16];
  undefined1 local_8a0 [16];
  uint local_890;
  uint local_88c;
  float local_888;
  float local_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  RTCFilterFunctionNArguments local_830;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  Primitive *local_7b0;
  ulong local_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  ulong local_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  RTCHitN local_440 [16];
  undefined1 auStack_430 [16];
  undefined4 local_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  float local_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [16];
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [16];
  uint local_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  uint uStack_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  
  uVar64 = (ulong)(byte)prim[1];
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 4 + 6)));
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 5 + 6)));
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 6 + 6)));
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0xf + 6)));
  lVar60 = uVar64 * 0x25;
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x11 + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1a + 6)));
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1b + 6)));
  fVar6 = *(float *)(prim + lVar60 + 0x12);
  auVar252._4_4_ = fVar6;
  auVar252._0_4_ = fVar6;
  auVar252._8_4_ = fVar6;
  auVar252._12_4_ = fVar6;
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar84 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar69 = vsubps_avx(auVar84,*(undefined1 (*) [16])(prim + lVar60 + 6));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1c + 6)));
  fVar153 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar60 + 0x16)) *
            *(float *)(prim + lVar60 + 0x1a);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar64 * 7 + 6);
  auVar24 = vpmovsxwd_avx(auVar84);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar64 * 0xb + 6);
  auVar25 = vpmovsxwd_avx(auVar83);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar64 * 9 + 6);
  auVar139 = vpmovsxwd_avx(auVar85);
  auVar66 = vpbroadcastd_avx512vl();
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar64 * 0xd + 6);
  auVar67 = vpmovsxwd_avx512vl(auVar79);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar64 * 0x12 + 6);
  auVar68 = vpmovsxwd_avx512vl(auVar86);
  auVar84 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar84 = vinsertps_avx512f(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar253._0_4_ = fVar6 * auVar69._0_4_;
  auVar253._4_4_ = fVar6 * auVar69._4_4_;
  auVar253._8_4_ = fVar6 * auVar69._8_4_;
  auVar253._12_4_ = fVar6 * auVar69._12_4_;
  auVar69 = vmulps_avx512vl(auVar252,auVar84);
  auVar70 = vcvtdq2ps_avx512vl(auVar76);
  auVar71 = vcvtdq2ps_avx512vl(auVar75);
  auVar72 = vcvtdq2ps_avx512vl(auVar72);
  auVar73 = vcvtdq2ps_avx512vl(auVar73);
  auVar74 = vcvtdq2ps_avx512vl(auVar74);
  auVar84 = vcvtdq2ps_avx(auVar77);
  auVar83 = vcvtdq2ps_avx(auVar78);
  auVar85 = vcvtdq2ps_avx(auVar22);
  auVar79 = vcvtdq2ps_avx(auVar23);
  uVar154 = auVar69._0_4_;
  auVar240._4_4_ = uVar154;
  auVar240._0_4_ = uVar154;
  auVar240._8_4_ = uVar154;
  auVar240._12_4_ = uVar154;
  auVar86 = vshufps_avx(auVar69,auVar69,0x55);
  auVar76 = vshufps_avx(auVar69,auVar69,0xaa);
  auVar75 = vmulps_avx512vl(auVar76,auVar72);
  auVar156._0_4_ = auVar76._0_4_ * auVar84._0_4_;
  auVar156._4_4_ = auVar76._4_4_ * auVar84._4_4_;
  auVar156._8_4_ = auVar76._8_4_ * auVar84._8_4_;
  auVar156._12_4_ = auVar76._12_4_ * auVar84._12_4_;
  auVar69._0_4_ = auVar79._0_4_ * auVar76._0_4_;
  auVar69._4_4_ = auVar79._4_4_ * auVar76._4_4_;
  auVar69._8_4_ = auVar79._8_4_ * auVar76._8_4_;
  auVar69._12_4_ = auVar79._12_4_ * auVar76._12_4_;
  auVar76 = vfmadd231ps_avx512vl(auVar75,auVar86,auVar71);
  auVar75 = vfmadd231ps_avx512vl(auVar156,auVar86,auVar74);
  auVar86 = vfmadd231ps_fma(auVar69,auVar85,auVar86);
  auVar77 = vfmadd231ps_avx512vl(auVar76,auVar240,auVar70);
  auVar78 = vfmadd231ps_avx512vl(auVar75,auVar240,auVar73);
  auVar75 = vfmadd231ps_fma(auVar86,auVar83,auVar240);
  auVar250._4_4_ = auVar253._0_4_;
  auVar250._0_4_ = auVar253._0_4_;
  auVar250._8_4_ = auVar253._0_4_;
  auVar250._12_4_ = auVar253._0_4_;
  auVar86 = vshufps_avx(auVar253,auVar253,0x55);
  auVar76 = vshufps_avx(auVar253,auVar253,0xaa);
  auVar72 = vmulps_avx512vl(auVar76,auVar72);
  auVar241._0_4_ = auVar76._0_4_ * auVar84._0_4_;
  auVar241._4_4_ = auVar76._4_4_ * auVar84._4_4_;
  auVar241._8_4_ = auVar76._8_4_ * auVar84._8_4_;
  auVar241._12_4_ = auVar76._12_4_ * auVar84._12_4_;
  auVar201._0_4_ = auVar76._0_4_ * auVar79._0_4_;
  auVar201._4_4_ = auVar76._4_4_ * auVar79._4_4_;
  auVar201._8_4_ = auVar76._8_4_ * auVar79._8_4_;
  auVar201._12_4_ = auVar76._12_4_ * auVar79._12_4_;
  auVar79 = vfmadd231ps_avx512vl(auVar72,auVar86,auVar71);
  auVar76 = vfmadd231ps_avx512vl(auVar241,auVar86,auVar74);
  auVar84 = vfmadd231ps_fma(auVar201,auVar86,auVar85);
  auVar70 = vfmadd231ps_avx512vl(auVar79,auVar250,auVar70);
  auVar71 = vfmadd231ps_avx512vl(auVar76,auVar250,auVar73);
  auVar69 = vfmadd231ps_fma(auVar84,auVar250,auVar83);
  auVar248._8_4_ = 0x7fffffff;
  auVar248._0_8_ = 0x7fffffff7fffffff;
  auVar248._12_4_ = 0x7fffffff;
  auVar84 = vandps_avx(auVar248,auVar77);
  auVar244._8_4_ = 0x219392ef;
  auVar244._0_8_ = 0x219392ef219392ef;
  auVar244._12_4_ = 0x219392ef;
  uVar56 = vcmpps_avx512vl(auVar84,auVar244,1);
  bVar61 = (bool)((byte)uVar56 & 1);
  auVar80._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar77._0_4_;
  bVar61 = (bool)((byte)(uVar56 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar77._4_4_;
  bVar61 = (bool)((byte)(uVar56 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar77._8_4_;
  bVar61 = (bool)((byte)(uVar56 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar77._12_4_;
  auVar84 = vandps_avx(auVar248,auVar78);
  uVar56 = vcmpps_avx512vl(auVar84,auVar244,1);
  bVar61 = (bool)((byte)uVar56 & 1);
  auVar81._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar78._0_4_;
  bVar61 = (bool)((byte)(uVar56 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar78._4_4_;
  bVar61 = (bool)((byte)(uVar56 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar78._8_4_;
  bVar61 = (bool)((byte)(uVar56 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar78._12_4_;
  auVar84 = vandps_avx(auVar248,auVar75);
  uVar56 = vcmpps_avx512vl(auVar84,auVar244,1);
  bVar61 = (bool)((byte)uVar56 & 1);
  auVar82._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar75._0_4_;
  bVar61 = (bool)((byte)(uVar56 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar75._4_4_;
  bVar61 = (bool)((byte)(uVar56 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar75._8_4_;
  bVar61 = (bool)((byte)(uVar56 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar75._12_4_;
  auVar83 = vrcp14ps_avx512vl(auVar80);
  auVar245._8_4_ = 0x3f800000;
  auVar245._0_8_ = 0x3f8000003f800000;
  auVar245._12_4_ = 0x3f800000;
  auVar84 = vfnmadd213ps_fma(auVar80,auVar83,auVar245);
  auVar79 = vfmadd132ps_fma(auVar84,auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar81);
  auVar84 = vfnmadd213ps_fma(auVar81,auVar83,auVar245);
  auVar86 = vfmadd132ps_fma(auVar84,auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar82);
  auVar84 = vfnmadd213ps_fma(auVar82,auVar83,auVar245);
  auVar22 = vfmadd132ps_fma(auVar84,auVar83,auVar83);
  auVar218._4_4_ = fVar153;
  auVar218._0_4_ = fVar153;
  auVar218._8_4_ = fVar153;
  auVar218._12_4_ = fVar153;
  auVar84 = vcvtdq2ps_avx(auVar24);
  auVar83 = vcvtdq2ps_avx(auVar25);
  auVar83 = vsubps_avx(auVar83,auVar84);
  auVar23 = vfmadd213ps_fma(auVar83,auVar218,auVar84);
  auVar84 = vcvtdq2ps_avx(auVar139);
  auVar83 = vcvtdq2ps_avx512vl(auVar67);
  auVar83 = vsubps_avx(auVar83,auVar84);
  auVar24 = vfmadd213ps_fma(auVar83,auVar218,auVar84);
  auVar83 = vcvtdq2ps_avx512vl(auVar68);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar64 * 0x16 + 6);
  auVar84 = vpmovsxwd_avx(auVar76);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar83);
  auVar76 = vfmadd213ps_fma(auVar84,auVar218,auVar83);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar64 * 0x14 + 6);
  auVar84 = vpmovsxwd_avx(auVar75);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar64 * 0x18 + 6);
  auVar83 = vpmovsxwd_avx(auVar72);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar85 = vsubps_avx(auVar83,auVar84);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar64 * 0x1d + 6);
  auVar83 = vpmovsxwd_avx(auVar73);
  auVar85 = vfmadd213ps_fma(auVar85,auVar218,auVar84);
  auVar84 = vcvtdq2ps_avx(auVar83);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar64 * 0x21 + 6);
  auVar83 = vpmovsxwd_avx(auVar74);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar84);
  auVar75 = vfmadd213ps_fma(auVar83,auVar218,auVar84);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar64 * 0x1f + 6);
  auVar84 = vpmovsxwd_avx(auVar77);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar64 * 0x23 + 6);
  auVar83 = vpmovsxwd_avx(auVar78);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar83 = vsubps_avx(auVar83,auVar84);
  auVar83 = vfmadd213ps_fma(auVar83,auVar218,auVar84);
  auVar84 = vsubps_avx512vl(auVar23,auVar70);
  auVar219._0_4_ = auVar79._0_4_ * auVar84._0_4_;
  auVar219._4_4_ = auVar79._4_4_ * auVar84._4_4_;
  auVar219._8_4_ = auVar79._8_4_ * auVar84._8_4_;
  auVar219._12_4_ = auVar79._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx512vl(auVar24,auVar70);
  auVar68._0_4_ = auVar79._0_4_ * auVar84._0_4_;
  auVar68._4_4_ = auVar79._4_4_ * auVar84._4_4_;
  auVar68._8_4_ = auVar79._8_4_ * auVar84._8_4_;
  auVar68._12_4_ = auVar79._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar76,auVar71);
  auVar70._0_4_ = auVar86._0_4_ * auVar84._0_4_;
  auVar70._4_4_ = auVar86._4_4_ * auVar84._4_4_;
  auVar70._8_4_ = auVar86._8_4_ * auVar84._8_4_;
  auVar70._12_4_ = auVar86._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar85,auVar71);
  auVar67._0_4_ = auVar86._0_4_ * auVar84._0_4_;
  auVar67._4_4_ = auVar86._4_4_ * auVar84._4_4_;
  auVar67._8_4_ = auVar86._8_4_ * auVar84._8_4_;
  auVar67._12_4_ = auVar86._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar75,auVar69);
  auVar71._0_4_ = auVar22._0_4_ * auVar84._0_4_;
  auVar71._4_4_ = auVar22._4_4_ * auVar84._4_4_;
  auVar71._8_4_ = auVar22._8_4_ * auVar84._8_4_;
  auVar71._12_4_ = auVar22._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar83,auVar69);
  auVar139._0_4_ = auVar22._0_4_ * auVar84._0_4_;
  auVar139._4_4_ = auVar22._4_4_ * auVar84._4_4_;
  auVar139._8_4_ = auVar22._8_4_ * auVar84._8_4_;
  auVar139._12_4_ = auVar22._12_4_ * auVar84._12_4_;
  auVar84 = vpminsd_avx(auVar219,auVar68);
  auVar83 = vpminsd_avx(auVar70,auVar67);
  auVar84 = vmaxps_avx(auVar84,auVar83);
  auVar83 = vpminsd_avx(auVar71,auVar139);
  uVar154 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar22._4_4_ = uVar154;
  auVar22._0_4_ = uVar154;
  auVar22._8_4_ = uVar154;
  auVar22._12_4_ = uVar154;
  auVar83 = vmaxps_avx512vl(auVar83,auVar22);
  auVar84 = vmaxps_avx(auVar84,auVar83);
  auVar23._8_4_ = 0x3f7ffffa;
  auVar23._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar23._12_4_ = 0x3f7ffffa;
  local_320 = vmulps_avx512vl(auVar84,auVar23);
  auVar84 = vpmaxsd_avx(auVar219,auVar68);
  auVar83 = vpmaxsd_avx(auVar70,auVar67);
  auVar84 = vminps_avx(auVar84,auVar83);
  auVar83 = vpmaxsd_avx(auVar71,auVar139);
  uVar154 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar24._4_4_ = uVar154;
  auVar24._0_4_ = uVar154;
  auVar24._8_4_ = uVar154;
  auVar24._12_4_ = uVar154;
  auVar83 = vminps_avx512vl(auVar83,auVar24);
  auVar84 = vminps_avx(auVar84,auVar83);
  auVar25._8_4_ = 0x3f800003;
  auVar25._0_8_ = 0x3f8000033f800003;
  auVar25._12_4_ = 0x3f800003;
  auVar84 = vmulps_avx512vl(auVar84,auVar25);
  uVar26 = vcmpps_avx512vl(local_320,auVar84,2);
  uVar29 = vpcmpgtd_avx512vl(auVar66,_DAT_01f4ad30);
  local_5c8 = CONCAT44((int)((ulong)context >> 0x20),(uint)((byte)uVar26 & 0xf & (byte)uVar29));
  local_470 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_7b0 = prim;
LAB_01907b2d:
  auVar98._8_4_ = 0x7fffffff;
  auVar98._0_8_ = 0x7fffffff7fffffff;
  auVar98._12_4_ = 0x7fffffff;
  auVar98._16_4_ = 0x7fffffff;
  auVar98._20_4_ = 0x7fffffff;
  auVar98._24_4_ = 0x7fffffff;
  auVar98._28_4_ = 0x7fffffff;
  if (local_5c8 == 0) {
    return;
  }
  lVar60 = 0;
  for (uVar56 = local_5c8; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
    lVar60 = lVar60 + 1;
  }
  uVar7 = *(uint *)(prim + 2);
  local_7a8 = (ulong)*(uint *)(prim + lVar60 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar7].ptr;
  uVar56 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           local_7a8 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar6 = (pGVar8->time_range).lower;
  fVar6 = pGVar8->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0x70) - fVar6) / ((pGVar8->time_range).upper - fVar6));
  auVar84 = vroundss_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6),9);
  auVar84 = vminss_avx(auVar84,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar84 = vmaxss_avx(ZEXT816(0) << 0x20,auVar84);
  fVar6 = fVar6 - auVar84._0_4_;
  fVar153 = 1.0 - fVar6;
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar58 = (long)(int)auVar84._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + 0x10 + lVar58);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar58);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar58);
  pfVar5 = (float *)(lVar11 + lVar12 * uVar56);
  auVar140._0_4_ = fVar6 * *pfVar5;
  auVar140._4_4_ = fVar6 * pfVar5[1];
  auVar140._8_4_ = fVar6 * pfVar5[2];
  auVar140._12_4_ = fVar6 * pfVar5[3];
  lVar60 = uVar56 + 1;
  pfVar5 = (float *)(lVar11 + lVar12 * lVar60);
  auVar157._0_4_ = fVar6 * *pfVar5;
  auVar157._4_4_ = fVar6 * pfVar5[1];
  auVar157._8_4_ = fVar6 * pfVar5[2];
  auVar157._12_4_ = fVar6 * pfVar5[3];
  p_Var13 = pGVar8[4].occlusionFilterN;
  auVar178._4_4_ = fVar153;
  auVar178._0_4_ = fVar153;
  auVar178._8_4_ = fVar153;
  auVar178._12_4_ = fVar153;
  auVar79 = vfmadd231ps_fma(auVar140,auVar178,
                            *(undefined1 (*) [16])(*(long *)(_Var9 + lVar58) + lVar10 * uVar56));
  auVar86 = vfmadd231ps_fma(auVar157,auVar178,
                            *(undefined1 (*) [16])(*(long *)(_Var9 + lVar58) + lVar10 * lVar60));
  pfVar5 = (float *)(*(long *)(p_Var13 + lVar58 + 0x38) +
                    uVar56 * *(long *)(p_Var13 + lVar58 + 0x48));
  auVar209._0_4_ = fVar6 * *pfVar5;
  auVar209._4_4_ = fVar6 * pfVar5[1];
  auVar209._8_4_ = fVar6 * pfVar5[2];
  auVar209._12_4_ = fVar6 * pfVar5[3];
  pfVar5 = (float *)(*(long *)(p_Var13 + lVar58 + 0x38) +
                    *(long *)(p_Var13 + lVar58 + 0x48) * lVar60);
  auVar202._0_4_ = fVar6 * *pfVar5;
  auVar202._4_4_ = fVar6 * pfVar5[1];
  auVar202._8_4_ = fVar6 * pfVar5[2];
  auVar202._12_4_ = fVar6 * pfVar5[3];
  auVar85 = vfmadd231ps_fma(auVar209,auVar178,
                            *(undefined1 (*) [16])
                             (*(long *)(p_Var13 + lVar58) +
                             *(long *)(p_Var13 + lVar58 + 0x10) * uVar56));
  auVar76 = vfmadd231ps_fma(auVar202,auVar178,
                            *(undefined1 (*) [16])
                             (*(long *)(p_Var13 + lVar58) +
                             *(long *)(p_Var13 + lVar58 + 0x10) * lVar60));
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar83 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_6a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  auVar257 = ZEXT3264(local_6a0);
  local_2e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar84 = vunpcklps_avx512vl(local_6a0._0_16_,local_2e0._0_16_);
  local_6c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar259 = ZEXT3264(local_6c0);
  auVar73 = local_6c0._0_16_;
  local_6d0 = vinsertps_avx512f(auVar84,auVar73,0x28);
  auVar220._8_4_ = 0xbeaaaaab;
  auVar220._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar220._12_4_ = 0xbeaaaaab;
  auVar75 = vfnmadd213ps_fma(auVar85,auVar220,auVar79);
  auVar85 = vfmadd213ps_fma(auVar76,auVar220,auVar86);
  auVar221._0_4_ = auVar86._0_4_ + auVar79._0_4_ + auVar75._0_4_ + auVar85._0_4_;
  auVar221._4_4_ = auVar86._4_4_ + auVar79._4_4_ + auVar75._4_4_ + auVar85._4_4_;
  auVar221._8_4_ = auVar86._8_4_ + auVar79._8_4_ + auVar75._8_4_ + auVar85._8_4_;
  auVar221._12_4_ = auVar86._12_4_ + auVar79._12_4_ + auVar75._12_4_ + auVar85._12_4_;
  auVar66._8_4_ = 0x3e800000;
  auVar66._0_8_ = 0x3e8000003e800000;
  auVar66._12_4_ = 0x3e800000;
  auVar84 = vmulps_avx512vl(auVar221,auVar66);
  auVar84 = vsubps_avx(auVar84,auVar83);
  auVar84 = vdpps_avx(auVar84,local_6d0,0x7f);
  local_6e0 = vdpps_avx(local_6d0,local_6d0,0x7f);
  fVar6 = *(float *)(ray + k * 4 + 0x30);
  auVar228._4_12_ = ZEXT812(0) << 0x20;
  auVar228._0_4_ = local_6e0._0_4_;
  auVar72 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar228);
  auVar76 = vfnmadd213ss_fma(auVar72,local_6e0,ZEXT416(0x40000000));
  local_260 = auVar84._0_4_ * auVar72._0_4_ * auVar76._0_4_;
  auVar227 = ZEXT3264(_DAT_01f7b040);
  auVar235._4_4_ = local_260;
  auVar235._0_4_ = local_260;
  auVar235._8_4_ = local_260;
  auVar235._12_4_ = local_260;
  fStack_370 = local_260;
  _local_380 = auVar235;
  fStack_36c = local_260;
  fStack_368 = local_260;
  fStack_364 = local_260;
  auVar84 = vfmadd231ps_fma(auVar83,local_6d0,auVar235);
  auVar84 = vblendps_avx(auVar84,ZEXT816(0) << 0x40,8);
  auVar83 = vsubps_avx(auVar79,auVar84);
  auVar85 = vsubps_avx(auVar85,auVar84);
  auVar79 = vsubps_avx(auVar75,auVar84);
  auVar84 = vsubps_avx(auVar86,auVar84);
  uVar154 = auVar83._0_4_;
  local_780._4_4_ = uVar154;
  local_780._0_4_ = uVar154;
  local_780._8_4_ = uVar154;
  local_780._12_4_ = uVar154;
  local_780._16_4_ = uVar154;
  local_780._20_4_ = uVar154;
  local_780._24_4_ = uVar154;
  local_780._28_4_ = uVar154;
  auVar243 = ZEXT3264(local_780);
  auVar94._8_4_ = 1;
  auVar94._0_8_ = 0x100000001;
  auVar94._12_4_ = 1;
  auVar94._16_4_ = 1;
  auVar94._20_4_ = 1;
  auVar94._24_4_ = 1;
  auVar94._28_4_ = 1;
  local_560 = ZEXT1632(auVar83);
  local_740 = vpermps_avx2(auVar94,local_560);
  auVar95._8_4_ = 2;
  auVar95._0_8_ = 0x200000002;
  auVar95._12_4_ = 2;
  auVar95._16_4_ = 2;
  auVar95._20_4_ = 2;
  auVar95._24_4_ = 2;
  auVar95._28_4_ = 2;
  local_7a0 = vpermps_avx2(auVar95,local_560);
  auVar96._8_4_ = 3;
  auVar96._0_8_ = 0x300000003;
  auVar96._12_4_ = 3;
  auVar96._16_4_ = 3;
  auVar96._20_4_ = 3;
  auVar96._24_4_ = 3;
  auVar96._28_4_ = 3;
  auVar87 = vpermps_avx512vl(auVar96,local_560);
  auVar260 = ZEXT3264(auVar87);
  auVar237 = ZEXT3264(local_740);
  uVar154 = auVar79._0_4_;
  local_680._4_4_ = uVar154;
  local_680._0_4_ = uVar154;
  local_680._8_4_ = uVar154;
  local_680._12_4_ = uVar154;
  local_680._16_4_ = uVar154;
  local_680._20_4_ = uVar154;
  local_680._24_4_ = uVar154;
  local_680._28_4_ = uVar154;
  local_5a0 = ZEXT1632(auVar79);
  local_760 = vpermps_avx2(auVar94,local_5a0);
  auVar254 = ZEXT3264(local_760);
  auVar87 = vpermps_avx512vl(auVar95,local_5a0);
  auVar255 = ZEXT3264(auVar87);
  auVar88 = vpermps_avx512vl(auVar96,local_5a0);
  auVar256 = ZEXT3264(auVar88);
  auVar217 = ZEXT3264(local_680);
  auVar89 = vbroadcastss_avx512vl(auVar85);
  local_580 = ZEXT1632(auVar85);
  auVar90 = vpermps_avx512vl(auVar94,local_580);
  auVar91 = vpermps_avx512vl(auVar95,local_580);
  auVar92 = vpermps_avx512vl(auVar96,local_580);
  auVar93 = vbroadcastss_avx512vl(auVar84);
  _local_5c0 = ZEXT1632(auVar84);
  auVar94 = vpermps_avx512vl(auVar94,_local_5c0);
  auVar95 = vpermps_avx512vl(auVar95,_local_5c0);
  local_880 = vpermps_avx512vl(auVar96,_local_5c0);
  auVar258 = ZEXT3264(local_880);
  auVar239 = ZEXT3264(local_7a0);
  auVar84 = vmulss_avx512f(auVar73,auVar73);
  auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),local_2e0,local_2e0);
  auVar96 = vfmadd231ps_avx512vl(auVar96,local_6a0,local_6a0);
  local_220._0_4_ = auVar96._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  local_240 = vandps_avx(auVar98,local_220);
  local_620 = ZEXT416((uint)local_260);
  local_260 = fVar6 - local_260;
  auVar234 = ZEXT3264(local_760);
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_450 = vpbroadcastd_avx512vl();
  uVar56 = 0;
  local_a18 = 1;
  local_460 = vpbroadcastd_avx512vl();
  auVar84 = vsqrtss_avx(local_6e0,local_6e0);
  local_884 = auVar84._0_4_;
  auVar84 = vsqrtss_avx(local_6e0,local_6e0);
  local_888 = auVar84._0_4_;
  local_310 = ZEXT816(0x3f80000000000000);
  do {
    auVar84 = vmovshdup_avx(local_310);
    auVar84 = vsubps_avx(auVar84,local_310);
    fVar174 = auVar84._0_4_;
    fVar175 = fVar174 * 0.04761905;
    local_860._0_4_ = local_310._0_4_;
    local_860._4_4_ = local_860._0_4_;
    local_860._8_4_ = local_860._0_4_;
    local_860._12_4_ = local_860._0_4_;
    local_860._16_4_ = local_860._0_4_;
    local_860._20_4_ = local_860._0_4_;
    local_860._24_4_ = local_860._0_4_;
    local_860._28_4_ = local_860._0_4_;
    auVar203._4_4_ = fVar174;
    auVar203._0_4_ = fVar174;
    auVar203._8_4_ = fVar174;
    auVar203._12_4_ = fVar174;
    local_700._16_4_ = fVar174;
    local_700._0_16_ = auVar203;
    local_700._20_4_ = fVar174;
    local_700._24_4_ = fVar174;
    local_700._28_4_ = fVar174;
    auVar84 = vfmadd231ps_fma(local_860,local_700,auVar227._0_32_);
    auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar98 = vsubps_avx512vl(auVar97,ZEXT1632(auVar84));
    fVar153 = auVar84._0_4_;
    fVar171 = auVar84._4_4_;
    auVar100._4_4_ = auVar217._4_4_ * fVar171;
    auVar100._0_4_ = auVar217._0_4_ * fVar153;
    fVar172 = auVar84._8_4_;
    auVar100._8_4_ = auVar217._8_4_ * fVar172;
    fVar173 = auVar84._12_4_;
    auVar100._12_4_ = auVar217._12_4_ * fVar173;
    auVar100._16_4_ = auVar217._16_4_ * 0.0;
    auVar100._20_4_ = auVar217._20_4_ * 0.0;
    auVar100._24_4_ = auVar217._24_4_ * 0.0;
    auVar100._28_4_ = local_860._0_4_;
    auVar102 = ZEXT1632(auVar84);
    auVar101._4_4_ = auVar234._4_4_ * fVar171;
    auVar101._0_4_ = auVar234._0_4_ * fVar153;
    auVar101._8_4_ = auVar234._8_4_ * fVar172;
    auVar101._12_4_ = auVar234._12_4_ * fVar173;
    auVar101._16_4_ = auVar234._16_4_ * 0.0;
    auVar101._20_4_ = auVar234._20_4_ * 0.0;
    auVar101._24_4_ = auVar234._24_4_ * 0.0;
    auVar101._28_4_ = fVar174;
    auVar96 = vmulps_avx512vl(auVar255._0_32_,auVar102);
    auVar99 = vmulps_avx512vl(auVar256._0_32_,auVar102);
    auVar83 = vfmadd231ps_fma(auVar100,auVar98,auVar243._0_32_);
    auVar85 = vfmadd231ps_fma(auVar101,auVar98,auVar237._0_32_);
    auVar79 = vfmadd231ps_fma(auVar96,auVar98,auVar239._0_32_);
    local_800 = auVar260._0_32_;
    auVar96 = vfmadd231ps_avx512vl(auVar99,auVar98,local_800);
    auVar100 = vmulps_avx512vl(auVar89,auVar102);
    auVar106 = ZEXT1632(auVar84);
    auVar101 = vmulps_avx512vl(auVar90,auVar106);
    auVar99 = vmulps_avx512vl(auVar91,auVar106);
    auVar102 = vmulps_avx512vl(auVar92,auVar106);
    auVar86 = vfmadd231ps_fma(auVar100,auVar98,auVar217._0_32_);
    auVar76 = vfmadd231ps_fma(auVar101,auVar98,auVar234._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar99,auVar98,auVar255._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar102,auVar98,auVar256._0_32_);
    auVar99 = vmulps_avx512vl(auVar93,auVar106);
    auVar102 = vmulps_avx512vl(auVar94,auVar106);
    auVar103 = vmulps_avx512vl(auVar95,auVar106);
    auVar104 = vmulps_avx512vl(auVar258._0_32_,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar99,auVar98,auVar89);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,auVar90);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar98,auVar91);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar98,auVar92);
    auVar217._28_36_ = auVar254._28_36_;
    auVar217._0_28_ =
         ZEXT1628(CONCAT412(fVar173 * auVar86._12_4_,
                            CONCAT48(fVar172 * auVar86._8_4_,
                                     CONCAT44(fVar171 * auVar86._4_4_,fVar153 * auVar86._0_4_))));
    auVar99 = vmulps_avx512vl(auVar106,ZEXT1632(auVar76));
    auVar106 = vmulps_avx512vl(ZEXT1632(auVar84),auVar100);
    auVar107 = vmulps_avx512vl(ZEXT1632(auVar84),auVar101);
    auVar84 = vfmadd231ps_fma(auVar217._0_32_,auVar98,ZEXT1632(auVar83));
    auVar108 = vfmadd231ps_avx512vl(auVar99,auVar98,ZEXT1632(auVar85));
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar98,ZEXT1632(auVar79));
    auVar109 = vfmadd231ps_avx512vl(auVar107,auVar98,auVar96);
    auVar99._4_4_ = auVar105._4_4_ * fVar171;
    auVar99._0_4_ = auVar105._0_4_ * fVar153;
    auVar99._8_4_ = auVar105._8_4_ * fVar172;
    auVar99._12_4_ = auVar105._12_4_ * fVar173;
    auVar99._16_4_ = auVar105._16_4_ * 0.0;
    auVar99._20_4_ = auVar105._20_4_ * 0.0;
    auVar99._24_4_ = auVar105._24_4_ * 0.0;
    auVar99._28_4_ = auVar96._28_4_;
    auVar107._4_4_ = auVar102._4_4_ * fVar171;
    auVar107._0_4_ = auVar102._0_4_ * fVar153;
    auVar107._8_4_ = auVar102._8_4_ * fVar172;
    auVar107._12_4_ = auVar102._12_4_ * fVar173;
    auVar107._16_4_ = auVar102._16_4_ * 0.0;
    auVar107._20_4_ = auVar102._20_4_ * 0.0;
    auVar107._24_4_ = auVar102._24_4_ * 0.0;
    auVar107._28_4_ = auVar105._28_4_;
    auVar110._4_4_ = auVar103._4_4_ * fVar171;
    auVar110._0_4_ = auVar103._0_4_ * fVar153;
    auVar110._8_4_ = auVar103._8_4_ * fVar172;
    auVar110._12_4_ = auVar103._12_4_ * fVar173;
    auVar110._16_4_ = auVar103._16_4_ * 0.0;
    auVar110._20_4_ = auVar103._20_4_ * 0.0;
    auVar110._24_4_ = auVar103._24_4_ * 0.0;
    auVar110._28_4_ = auVar102._28_4_;
    auVar111._4_4_ = auVar104._4_4_ * fVar171;
    auVar111._0_4_ = auVar104._0_4_ * fVar153;
    auVar111._8_4_ = auVar104._8_4_ * fVar172;
    auVar111._12_4_ = auVar104._12_4_ * fVar173;
    auVar111._16_4_ = auVar104._16_4_ * 0.0;
    auVar111._20_4_ = auVar104._20_4_ * 0.0;
    auVar111._24_4_ = auVar104._24_4_ * 0.0;
    auVar111._28_4_ = auVar103._28_4_;
    auVar83 = vfmadd231ps_fma(auVar99,auVar98,ZEXT1632(auVar86));
    auVar85 = vfmadd231ps_fma(auVar107,auVar98,ZEXT1632(auVar76));
    auVar79 = vfmadd231ps_fma(auVar110,auVar98,auVar100);
    auVar86 = vfmadd231ps_fma(auVar111,auVar98,auVar101);
    auVar76 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar173 * auVar83._12_4_,
                                                 CONCAT48(fVar172 * auVar83._8_4_,
                                                          CONCAT44(fVar171 * auVar83._4_4_,
                                                                   fVar153 * auVar83._0_4_)))),
                              auVar98,ZEXT1632(auVar84));
    auVar107 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar85._12_4_ * fVar173,
                                             CONCAT48(auVar85._8_4_ * fVar172,
                                                      CONCAT44(auVar85._4_4_ * fVar171,
                                                               auVar85._0_4_ * fVar153)))),auVar98,
                          auVar108);
    auVar110 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar79._12_4_ * fVar173,
                                             CONCAT48(auVar79._8_4_ * fVar172,
                                                      CONCAT44(auVar79._4_4_ * fVar171,
                                                               auVar79._0_4_ * fVar153)))),auVar98,
                          auVar106);
    auVar96 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar86._12_4_ * fVar173,
                                            CONCAT48(auVar86._8_4_ * fVar172,
                                                     CONCAT44(auVar86._4_4_ * fVar171,
                                                              auVar86._0_4_ * fVar153)))),auVar109,
                         auVar98);
    auVar98 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar84));
    auVar100 = vsubps_avx512vl(ZEXT1632(auVar85),auVar108);
    auVar101 = vsubps_avx512vl(ZEXT1632(auVar79),auVar106);
    auVar99 = vsubps_avx512vl(ZEXT1632(auVar86),auVar109);
    auVar124._0_4_ = fVar175 * auVar98._0_4_ * 3.0;
    auVar124._4_4_ = fVar175 * auVar98._4_4_ * 3.0;
    auVar124._8_4_ = fVar175 * auVar98._8_4_ * 3.0;
    auVar124._12_4_ = fVar175 * auVar98._12_4_ * 3.0;
    auVar124._16_4_ = fVar175 * auVar98._16_4_ * 3.0;
    auVar124._20_4_ = fVar175 * auVar98._20_4_ * 3.0;
    auVar124._24_4_ = fVar175 * auVar98._24_4_ * 3.0;
    auVar124._28_4_ = 0;
    auVar125._0_4_ = fVar175 * auVar100._0_4_ * 3.0;
    auVar125._4_4_ = fVar175 * auVar100._4_4_ * 3.0;
    auVar125._8_4_ = fVar175 * auVar100._8_4_ * 3.0;
    auVar125._12_4_ = fVar175 * auVar100._12_4_ * 3.0;
    auVar125._16_4_ = fVar175 * auVar100._16_4_ * 3.0;
    auVar125._20_4_ = fVar175 * auVar100._20_4_ * 3.0;
    auVar125._24_4_ = fVar175 * auVar100._24_4_ * 3.0;
    auVar125._28_4_ = 0;
    auVar108._4_4_ = fVar175 * auVar101._4_4_ * 3.0;
    auVar108._0_4_ = fVar175 * auVar101._0_4_ * 3.0;
    auVar108._8_4_ = fVar175 * auVar101._8_4_ * 3.0;
    auVar108._12_4_ = fVar175 * auVar101._12_4_ * 3.0;
    auVar108._16_4_ = fVar175 * auVar101._16_4_ * 3.0;
    auVar108._20_4_ = fVar175 * auVar101._20_4_ * 3.0;
    auVar108._24_4_ = fVar175 * auVar101._24_4_ * 3.0;
    auVar108._28_4_ = auVar104._28_4_;
    fVar153 = auVar99._0_4_ * 3.0 * fVar175;
    fVar171 = auVar99._4_4_ * 3.0 * fVar175;
    auVar109._4_4_ = fVar171;
    auVar109._0_4_ = fVar153;
    fVar172 = auVar99._8_4_ * 3.0 * fVar175;
    auVar109._8_4_ = fVar172;
    fVar173 = auVar99._12_4_ * 3.0 * fVar175;
    auVar109._12_4_ = fVar173;
    fVar174 = auVar99._16_4_ * 3.0 * fVar175;
    auVar109._16_4_ = fVar174;
    fVar176 = auVar99._20_4_ * 3.0 * fVar175;
    auVar109._20_4_ = fVar176;
    fVar177 = auVar99._24_4_ * 3.0 * fVar175;
    auVar109._24_4_ = fVar177;
    auVar109._28_4_ = fVar175;
    auVar84 = vxorps_avx512vl(auVar258._0_16_,auVar258._0_16_);
    auVar111 = vpermt2ps_avx512vl(ZEXT1632(auVar76),_DAT_01fb9fc0,ZEXT1632(auVar84));
    auVar112 = vpermt2ps_avx512vl(auVar107,_DAT_01fb9fc0,ZEXT1632(auVar84));
    auVar100 = ZEXT1632(auVar84);
    auVar113 = vpermt2ps_avx512vl(auVar110,_DAT_01fb9fc0,auVar100);
    auVar114._0_4_ = auVar96._0_4_ + fVar153;
    auVar114._4_4_ = auVar96._4_4_ + fVar171;
    auVar114._8_4_ = auVar96._8_4_ + fVar172;
    auVar114._12_4_ = auVar96._12_4_ + fVar173;
    auVar114._16_4_ = auVar96._16_4_ + fVar174;
    auVar114._20_4_ = auVar96._20_4_ + fVar176;
    auVar114._24_4_ = auVar96._24_4_ + fVar177;
    auVar114._28_4_ = auVar96._28_4_ + fVar175;
    auVar98 = vmaxps_avx(auVar96,auVar114);
    auVar102 = vminps_avx512vl(auVar96,auVar114);
    auVar103 = vpermt2ps_avx512vl(auVar96,_DAT_01fb9fc0,auVar100);
    auVar114 = vpermt2ps_avx512vl(auVar124,_DAT_01fb9fc0,auVar100);
    auVar115 = vpermt2ps_avx512vl(auVar125,_DAT_01fb9fc0,auVar100);
    auVar121 = ZEXT1632(auVar84);
    auVar116 = vpermt2ps_avx512vl(auVar108,_DAT_01fb9fc0,auVar121);
    auVar96 = vpermt2ps_avx512vl(auVar109,_DAT_01fb9fc0,auVar121);
    auVar96 = vsubps_avx(auVar103,auVar96);
    auVar100 = vsubps_avx(auVar111,ZEXT1632(auVar76));
    auVar101 = vsubps_avx(auVar112,auVar107);
    auVar99 = vsubps_avx(auVar113,auVar110);
    auVar104 = vmulps_avx512vl(auVar101,auVar108);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar125,auVar99);
    auVar105 = vmulps_avx512vl(auVar99,auVar124);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar108,auVar100);
    auVar106 = vmulps_avx512vl(auVar100,auVar125);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar124,auVar101);
    auVar106 = vmulps_avx512vl(auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar104);
    auVar105 = vmulps_avx512vl(auVar99,auVar99);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar101,auVar101);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar100,auVar100);
    auVar106 = vrcp14ps_avx512vl(auVar105);
    auVar109 = vfnmadd213ps_avx512vl(auVar106,auVar105,auVar97);
    auVar106 = vfmadd132ps_avx512vl(auVar109,auVar106,auVar106);
    auVar104 = vmulps_avx512vl(auVar104,auVar106);
    auVar109 = vmulps_avx512vl(auVar101,auVar116);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar115,auVar99);
    auVar117 = vmulps_avx512vl(auVar99,auVar114);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar116,auVar100);
    auVar118 = vmulps_avx512vl(auVar100,auVar115);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar114,auVar101);
    auVar118 = vmulps_avx512vl(auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar109 = vfmadd231ps_avx512vl(auVar117,auVar109,auVar109);
    auVar106 = vmulps_avx512vl(auVar109,auVar106);
    auVar104 = vmaxps_avx512vl(auVar104,auVar106);
    auVar104 = vsqrtps_avx512vl(auVar104);
    auVar106 = vmaxps_avx512vl(auVar96,auVar103);
    auVar98 = vmaxps_avx512vl(auVar98,auVar106);
    auVar106 = vaddps_avx512vl(auVar104,auVar98);
    auVar98 = vminps_avx(auVar96,auVar103);
    auVar98 = vminps_avx512vl(auVar102,auVar98);
    auVar98 = vsubps_avx512vl(auVar98,auVar104);
    auVar102._8_4_ = 0x3f800002;
    auVar102._0_8_ = 0x3f8000023f800002;
    auVar102._12_4_ = 0x3f800002;
    auVar102._16_4_ = 0x3f800002;
    auVar102._20_4_ = 0x3f800002;
    auVar102._24_4_ = 0x3f800002;
    auVar102._28_4_ = 0x3f800002;
    auVar96 = vmulps_avx512vl(auVar106,auVar102);
    auVar103._8_4_ = 0x3f7ffffc;
    auVar103._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar103._12_4_ = 0x3f7ffffc;
    auVar103._16_4_ = 0x3f7ffffc;
    auVar103._20_4_ = 0x3f7ffffc;
    auVar103._24_4_ = 0x3f7ffffc;
    auVar103._28_4_ = 0x3f7ffffc;
    local_720 = vmulps_avx512vl(auVar98,auVar103);
    auVar98 = vmulps_avx512vl(auVar96,auVar96);
    auVar96 = vrsqrt14ps_avx512vl(auVar105);
    auVar104._8_4_ = 0xbf000000;
    auVar104._0_8_ = 0xbf000000bf000000;
    auVar104._12_4_ = 0xbf000000;
    auVar104._16_4_ = 0xbf000000;
    auVar104._20_4_ = 0xbf000000;
    auVar104._24_4_ = 0xbf000000;
    auVar104._28_4_ = 0xbf000000;
    auVar102 = vmulps_avx512vl(auVar105,auVar104);
    fVar153 = auVar96._0_4_;
    fVar171 = auVar96._4_4_;
    fVar172 = auVar96._8_4_;
    fVar173 = auVar96._12_4_;
    fVar175 = auVar96._16_4_;
    fVar174 = auVar96._20_4_;
    fVar176 = auVar96._24_4_;
    auVar117._4_4_ = fVar171 * fVar171 * fVar171 * auVar102._4_4_;
    auVar117._0_4_ = fVar153 * fVar153 * fVar153 * auVar102._0_4_;
    auVar117._8_4_ = fVar172 * fVar172 * fVar172 * auVar102._8_4_;
    auVar117._12_4_ = fVar173 * fVar173 * fVar173 * auVar102._12_4_;
    auVar117._16_4_ = fVar175 * fVar175 * fVar175 * auVar102._16_4_;
    auVar117._20_4_ = fVar174 * fVar174 * fVar174 * auVar102._20_4_;
    auVar117._24_4_ = fVar176 * fVar176 * fVar176 * auVar102._24_4_;
    auVar117._28_4_ = auVar106._28_4_;
    auVar105._8_4_ = 0x3fc00000;
    auVar105._0_8_ = 0x3fc000003fc00000;
    auVar105._12_4_ = 0x3fc00000;
    auVar105._16_4_ = 0x3fc00000;
    auVar105._20_4_ = 0x3fc00000;
    auVar105._24_4_ = 0x3fc00000;
    auVar105._28_4_ = 0x3fc00000;
    auVar96 = vfmadd231ps_avx512vl(auVar117,auVar96,auVar105);
    auVar254 = ZEXT3264(auVar96);
    auVar102 = vmulps_avx512vl(auVar100,auVar96);
    auVar103 = vmulps_avx512vl(auVar101,auVar96);
    auVar104 = vmulps_avx512vl(auVar99,auVar96);
    auVar216 = ZEXT1632(auVar76);
    auVar105 = vsubps_avx512vl(auVar121,auVar216);
    auVar109 = vsubps_avx512vl(auVar121,auVar107);
    auVar117 = vsubps_avx512vl(auVar121,auVar110);
    auVar106 = vmulps_avx512vl(auVar259._0_32_,auVar117);
    auVar106 = vfmadd231ps_avx512vl(auVar106,local_2e0,auVar109);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar257._0_32_,auVar105);
    auVar118 = vmulps_avx512vl(auVar117,auVar117);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar109,auVar109);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar105,auVar105);
    auVar119 = vmulps_avx512vl(auVar259._0_32_,auVar104);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar103,local_2e0);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar102,auVar257._0_32_);
    auVar104 = vmulps_avx512vl(auVar117,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar109,auVar103);
    auVar102 = vfmadd231ps_avx512vl(auVar103,auVar105,auVar102);
    auVar103 = vmulps_avx512vl(auVar119,auVar119);
    auVar104 = vsubps_avx512vl(local_220,auVar103);
    auVar120 = vmulps_avx512vl(auVar119,auVar102);
    auVar106 = vsubps_avx512vl(auVar106,auVar120);
    auVar120 = vaddps_avx512vl(auVar106,auVar106);
    auVar106 = vmulps_avx512vl(auVar102,auVar102);
    auVar118 = vsubps_avx512vl(auVar118,auVar106);
    auVar98 = vsubps_avx512vl(auVar118,auVar98);
    local_7e0 = vmulps_avx512vl(auVar120,auVar120);
    auVar106._8_4_ = 0x40800000;
    auVar106._0_8_ = 0x4080000040800000;
    auVar106._12_4_ = 0x40800000;
    auVar106._16_4_ = 0x40800000;
    auVar106._20_4_ = 0x40800000;
    auVar106._24_4_ = 0x40800000;
    auVar106._28_4_ = 0x40800000;
    _local_4a0 = vmulps_avx512vl(auVar104,auVar106);
    auVar106 = vmulps_avx512vl(_local_4a0,auVar98);
    auVar106 = vsubps_avx512vl(local_7e0,auVar106);
    uVar64 = vcmpps_avx512vl(auVar106,auVar121,5);
    bVar54 = (byte)uVar64;
    if (bVar54 == 0) {
LAB_0190888c:
      auVar227 = ZEXT3264(_DAT_01f7b040);
      auVar259 = ZEXT3264(local_6c0);
      auVar257 = ZEXT3264(local_6a0);
      auVar243 = ZEXT3264(local_780);
      auVar239 = ZEXT3264(local_7a0);
      auVar237 = ZEXT3264(local_740);
      auVar217 = ZEXT3264(local_680);
      auVar234 = ZEXT3264(local_760);
      auVar98 = vmovdqa64_avx512vl(auVar87);
      auVar255 = ZEXT3264(auVar98);
      auVar98 = vmovdqa64_avx512vl(auVar88);
      auVar256 = ZEXT3264(auVar98);
      auVar258 = ZEXT3264(local_880);
    }
    else {
      auVar106 = vsqrtps_avx512vl(auVar106);
      local_640 = vaddps_avx512vl(auVar104,auVar104);
      local_660 = vrcp14ps_avx512vl(local_640);
      auVar97 = vfnmadd213ps_avx512vl(local_660,local_640,auVar97);
      auVar121 = vfmadd132ps_avx512vl(auVar97,local_660,local_660);
      auVar97._8_4_ = 0x80000000;
      auVar97._0_8_ = 0x8000000080000000;
      auVar97._12_4_ = 0x80000000;
      auVar97._16_4_ = 0x80000000;
      auVar97._20_4_ = 0x80000000;
      auVar97._24_4_ = 0x80000000;
      auVar97._28_4_ = 0x80000000;
      local_4e0 = vxorps_avx512vl(auVar120,auVar97);
      auVar97 = vsubps_avx512vl(local_4e0,auVar106);
      local_4c0 = vmulps_avx512vl(auVar97,auVar121);
      auVar106 = vsubps_avx512vl(auVar106,auVar120);
      local_500 = vmulps_avx512vl(auVar106,auVar121);
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar97 = vblendmps_avx512vl(auVar106,local_4c0);
      auVar122._0_4_ =
           (uint)(bVar54 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar106._0_4_;
      bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar61 * auVar97._4_4_ | (uint)!bVar61 * auVar106._4_4_;
      bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar61 * auVar97._8_4_ | (uint)!bVar61 * auVar106._8_4_;
      bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar61 * auVar97._12_4_ | (uint)!bVar61 * auVar106._12_4_;
      bVar61 = (bool)((byte)(uVar64 >> 4) & 1);
      auVar122._16_4_ = (uint)bVar61 * auVar97._16_4_ | (uint)!bVar61 * auVar106._16_4_;
      bVar61 = (bool)((byte)(uVar64 >> 5) & 1);
      auVar122._20_4_ = (uint)bVar61 * auVar97._20_4_ | (uint)!bVar61 * auVar106._20_4_;
      bVar61 = (bool)((byte)(uVar64 >> 6) & 1);
      auVar122._24_4_ = (uint)bVar61 * auVar97._24_4_ | (uint)!bVar61 * auVar106._24_4_;
      bVar61 = SUB81(uVar64 >> 7,0);
      auVar122._28_4_ = (uint)bVar61 * auVar97._28_4_ | (uint)!bVar61 * auVar106._28_4_;
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar97 = vblendmps_avx512vl(auVar106,local_500);
      auVar123._0_4_ =
           (uint)(bVar54 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar106._0_4_;
      bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar123._4_4_ = (uint)bVar61 * auVar97._4_4_ | (uint)!bVar61 * auVar106._4_4_;
      bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar123._8_4_ = (uint)bVar61 * auVar97._8_4_ | (uint)!bVar61 * auVar106._8_4_;
      bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar123._12_4_ = (uint)bVar61 * auVar97._12_4_ | (uint)!bVar61 * auVar106._12_4_;
      bVar61 = (bool)((byte)(uVar64 >> 4) & 1);
      auVar123._16_4_ = (uint)bVar61 * auVar97._16_4_ | (uint)!bVar61 * auVar106._16_4_;
      bVar61 = (bool)((byte)(uVar64 >> 5) & 1);
      auVar123._20_4_ = (uint)bVar61 * auVar97._20_4_ | (uint)!bVar61 * auVar106._20_4_;
      bVar61 = (bool)((byte)(uVar64 >> 6) & 1);
      auVar123._24_4_ = (uint)bVar61 * auVar97._24_4_ | (uint)!bVar61 * auVar106._24_4_;
      bVar61 = SUB81(uVar64 >> 7,0);
      auVar123._28_4_ = (uint)bVar61 * auVar97._28_4_ | (uint)!bVar61 * auVar106._28_4_;
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar103,auVar106);
      local_520 = vmaxps_avx512vl(local_240,auVar106);
      auVar121._8_4_ = 0x36000000;
      auVar121._0_8_ = 0x3600000036000000;
      auVar121._12_4_ = 0x36000000;
      auVar121._16_4_ = 0x36000000;
      auVar121._20_4_ = 0x36000000;
      auVar121._24_4_ = 0x36000000;
      auVar121._28_4_ = 0x36000000;
      local_540 = vmulps_avx512vl(local_520,auVar121);
      vandps_avx512vl(auVar104,auVar106);
      uVar27 = vcmpps_avx512vl(local_540,local_540,1);
      uVar64 = uVar64 & uVar27;
      bVar59 = (byte)uVar64;
      if (bVar59 != 0) {
        uVar27 = vcmpps_avx512vl(auVar98,_DAT_01f7b000,2);
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar104 = vblendmps_avx512vl(auVar98,auVar103);
        bVar57 = (byte)uVar27;
        uVar65 = (uint)(bVar57 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar57 & 1) * local_540._0_4_;
        bVar61 = (bool)((byte)(uVar27 >> 1) & 1);
        uVar132 = (uint)bVar61 * auVar104._4_4_ | (uint)!bVar61 * local_540._4_4_;
        bVar61 = (bool)((byte)(uVar27 >> 2) & 1);
        uVar133 = (uint)bVar61 * auVar104._8_4_ | (uint)!bVar61 * local_540._8_4_;
        bVar61 = (bool)((byte)(uVar27 >> 3) & 1);
        uVar134 = (uint)bVar61 * auVar104._12_4_ | (uint)!bVar61 * local_540._12_4_;
        bVar61 = (bool)((byte)(uVar27 >> 4) & 1);
        uVar135 = (uint)bVar61 * auVar104._16_4_ | (uint)!bVar61 * local_540._16_4_;
        bVar61 = (bool)((byte)(uVar27 >> 5) & 1);
        uVar136 = (uint)bVar61 * auVar104._20_4_ | (uint)!bVar61 * local_540._20_4_;
        bVar61 = (bool)((byte)(uVar27 >> 6) & 1);
        uVar137 = (uint)bVar61 * auVar104._24_4_ | (uint)!bVar61 * local_540._24_4_;
        bVar61 = SUB81(uVar27 >> 7,0);
        uVar138 = (uint)bVar61 * auVar104._28_4_ | (uint)!bVar61 * local_540._28_4_;
        auVar122._0_4_ = (bVar59 & 1) * uVar65 | !(bool)(bVar59 & 1) * auVar122._0_4_;
        bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar122._4_4_ = bVar61 * uVar132 | !bVar61 * auVar122._4_4_;
        bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar122._8_4_ = bVar61 * uVar133 | !bVar61 * auVar122._8_4_;
        bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar122._12_4_ = bVar61 * uVar134 | !bVar61 * auVar122._12_4_;
        bVar61 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar122._16_4_ = bVar61 * uVar135 | !bVar61 * auVar122._16_4_;
        bVar61 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar122._20_4_ = bVar61 * uVar136 | !bVar61 * auVar122._20_4_;
        bVar61 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar122._24_4_ = bVar61 * uVar137 | !bVar61 * auVar122._24_4_;
        bVar61 = SUB81(uVar64 >> 7,0);
        auVar122._28_4_ = bVar61 * uVar138 | !bVar61 * auVar122._28_4_;
        auVar98 = vblendmps_avx512vl(auVar103,auVar98);
        bVar61 = (bool)((byte)(uVar27 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar27 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar27 >> 3) & 1);
        bVar17 = (bool)((byte)(uVar27 >> 4) & 1);
        bVar18 = (bool)((byte)(uVar27 >> 5) & 1);
        bVar19 = (bool)((byte)(uVar27 >> 6) & 1);
        bVar20 = SUB81(uVar27 >> 7,0);
        auVar123._0_4_ =
             (uint)(bVar59 & 1) *
             ((uint)(bVar57 & 1) * auVar98._0_4_ | !(bool)(bVar57 & 1) * uVar65) |
             !(bool)(bVar59 & 1) * auVar123._0_4_;
        bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar123._4_4_ =
             (uint)bVar14 * ((uint)bVar61 * auVar98._4_4_ | !bVar61 * uVar132) |
             !bVar14 * auVar123._4_4_;
        bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar123._8_4_ =
             (uint)bVar61 * ((uint)bVar15 * auVar98._8_4_ | !bVar15 * uVar133) |
             !bVar61 * auVar123._8_4_;
        bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar123._12_4_ =
             (uint)bVar61 * ((uint)bVar16 * auVar98._12_4_ | !bVar16 * uVar134) |
             !bVar61 * auVar123._12_4_;
        bVar61 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar123._16_4_ =
             (uint)bVar61 * ((uint)bVar17 * auVar98._16_4_ | !bVar17 * uVar135) |
             !bVar61 * auVar123._16_4_;
        bVar61 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar123._20_4_ =
             (uint)bVar61 * ((uint)bVar18 * auVar98._20_4_ | !bVar18 * uVar136) |
             !bVar61 * auVar123._20_4_;
        bVar61 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar123._24_4_ =
             (uint)bVar61 * ((uint)bVar19 * auVar98._24_4_ | !bVar19 * uVar137) |
             !bVar61 * auVar123._24_4_;
        bVar61 = SUB81(uVar64 >> 7,0);
        auVar123._28_4_ =
             (uint)bVar61 * ((uint)bVar20 * auVar98._28_4_ | !bVar20 * uVar138) |
             !bVar61 * auVar123._28_4_;
        bVar54 = (~bVar59 | bVar57) & bVar54;
      }
      if ((bVar54 & 0x7f) == 0) goto LAB_0190888c;
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar103 = vxorps_avx512vl(auVar116,auVar98);
      auVar104 = vxorps_avx512vl(auVar114,auVar98);
      auVar227 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
      auVar106 = vxorps_avx512vl(auVar115,auVar98);
      auVar84 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),ZEXT416((uint)local_620._0_4_)
                              );
      auVar97 = vbroadcastss_avx512vl(auVar84);
      auVar97 = vminps_avx512vl(auVar97,auVar123);
      auVar116._4_4_ = fStack_25c;
      auVar116._0_4_ = local_260;
      auVar116._8_4_ = fStack_258;
      auVar116._12_4_ = fStack_254;
      auVar116._16_4_ = fStack_250;
      auVar116._20_4_ = fStack_24c;
      auVar116._24_4_ = fStack_248;
      auVar116._28_4_ = fStack_244;
      auVar114 = vmaxps_avx512vl(auVar116,auVar122);
      auVar117 = vmulps_avx512vl(auVar117,auVar108);
      auVar109 = vfmadd213ps_avx512vl(auVar109,auVar125,auVar117);
      auVar84 = vfmadd213ps_fma(auVar105,auVar124,auVar109);
      auVar105 = vmulps_avx512vl(local_6c0,auVar108);
      auVar105 = vfmadd231ps_avx512vl(auVar105,local_2e0,auVar125);
      auVar105 = vfmadd231ps_avx512vl(auVar105,local_6a0,auVar124);
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar105,auVar108);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar26 = vcmpps_avx512vl(auVar108,auVar109,1);
      auVar117 = vxorps_avx512vl(ZEXT1632(auVar84),auVar98);
      auVar116 = vrcp14ps_avx512vl(auVar105);
      auVar124 = vxorps_avx512vl(auVar105,auVar98);
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar115 = vfnmadd213ps_avx512vl(auVar116,auVar105,auVar125);
      auVar84 = vfmadd132ps_fma(auVar115,auVar116,auVar116);
      fVar153 = auVar84._0_4_ * auVar117._0_4_;
      fVar171 = auVar84._4_4_ * auVar117._4_4_;
      auVar115._4_4_ = fVar171;
      auVar115._0_4_ = fVar153;
      fVar172 = auVar84._8_4_ * auVar117._8_4_;
      auVar115._8_4_ = fVar172;
      fVar173 = auVar84._12_4_ * auVar117._12_4_;
      auVar115._12_4_ = fVar173;
      fVar175 = auVar117._16_4_ * 0.0;
      auVar115._16_4_ = fVar175;
      fVar174 = auVar117._20_4_ * 0.0;
      auVar115._20_4_ = fVar174;
      fVar176 = auVar117._24_4_ * 0.0;
      auVar115._24_4_ = fVar176;
      auVar115._28_4_ = auVar117._28_4_;
      uVar29 = vcmpps_avx512vl(auVar105,auVar124,1);
      bVar59 = (byte)uVar26 | (byte)uVar29;
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar115 = vblendmps_avx512vl(auVar115,auVar121);
      auVar126._0_4_ =
           (uint)(bVar59 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar116._0_4_;
      bVar61 = (bool)(bVar59 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar61 * auVar115._4_4_ | (uint)!bVar61 * auVar116._4_4_;
      bVar61 = (bool)(bVar59 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar61 * auVar115._8_4_ | (uint)!bVar61 * auVar116._8_4_;
      bVar61 = (bool)(bVar59 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar61 * auVar115._12_4_ | (uint)!bVar61 * auVar116._12_4_;
      bVar61 = (bool)(bVar59 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar61 * auVar115._16_4_ | (uint)!bVar61 * auVar116._16_4_;
      bVar61 = (bool)(bVar59 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar61 * auVar115._20_4_ | (uint)!bVar61 * auVar116._20_4_;
      bVar61 = (bool)(bVar59 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar61 * auVar115._24_4_ | (uint)!bVar61 * auVar116._24_4_;
      auVar126._28_4_ =
           (uint)(bVar59 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar116._28_4_;
      auVar115 = vmaxps_avx512vl(auVar114,auVar126);
      uVar29 = vcmpps_avx512vl(auVar105,auVar124,6);
      bVar59 = (byte)uVar26 | (byte)uVar29;
      auVar127._0_4_ = (uint)(bVar59 & 1) * 0x7f800000 | (uint)!(bool)(bVar59 & 1) * (int)fVar153;
      bVar61 = (bool)(bVar59 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar171;
      bVar61 = (bool)(bVar59 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar172;
      bVar61 = (bool)(bVar59 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar173;
      bVar61 = (bool)(bVar59 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar175;
      bVar61 = (bool)(bVar59 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar174;
      bVar61 = (bool)(bVar59 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar176;
      auVar127._28_4_ =
           (uint)(bVar59 >> 7) * 0x7f800000 | (uint)!(bool)(bVar59 >> 7) * auVar117._28_4_;
      auVar105 = vminps_avx512vl(auVar97,auVar127);
      auVar84 = vxorps_avx512vl(auVar114._0_16_,auVar114._0_16_);
      auVar111 = vsubps_avx512vl(ZEXT1632(auVar84),auVar111);
      auVar117 = vsubps_avx512vl(ZEXT1632(auVar84),auVar112);
      auVar114 = ZEXT1632(auVar84);
      auVar97 = vsubps_avx512vl(auVar114,auVar113);
      auVar97 = vmulps_avx512vl(auVar97,auVar103);
      auVar117 = vfmadd231ps_avx512vl(auVar97,auVar106,auVar117);
      auVar111 = vfmadd231ps_avx512vl(auVar117,auVar104,auVar111);
      auVar103 = vmulps_avx512vl(local_6c0,auVar103);
      auVar103 = vfmadd231ps_avx512vl(auVar103,local_2e0,auVar106);
      auVar103 = vfmadd231ps_avx512vl(auVar103,local_6a0,auVar104);
      vandps_avx512vl(auVar103,auVar108);
      uVar26 = vcmpps_avx512vl(auVar103,auVar109,1);
      auVar104 = vxorps_avx512vl(auVar111,auVar98);
      auVar106 = vrcp14ps_avx512vl(auVar103);
      auVar98 = vxorps_avx512vl(auVar103,auVar98);
      auVar111 = vfnmadd213ps_avx512vl(auVar106,auVar103,auVar125);
      auVar84 = vfmadd132ps_fma(auVar111,auVar106,auVar106);
      fVar153 = auVar84._0_4_ * auVar104._0_4_;
      fVar171 = auVar84._4_4_ * auVar104._4_4_;
      auVar112._4_4_ = fVar171;
      auVar112._0_4_ = fVar153;
      fVar172 = auVar84._8_4_ * auVar104._8_4_;
      auVar112._8_4_ = fVar172;
      fVar173 = auVar84._12_4_ * auVar104._12_4_;
      auVar112._12_4_ = fVar173;
      fVar175 = auVar104._16_4_ * 0.0;
      auVar112._16_4_ = fVar175;
      fVar174 = auVar104._20_4_ * 0.0;
      auVar112._20_4_ = fVar174;
      fVar176 = auVar104._24_4_ * 0.0;
      auVar112._24_4_ = fVar176;
      auVar112._28_4_ = auVar104._28_4_;
      uVar29 = vcmpps_avx512vl(auVar103,auVar98,1);
      bVar59 = (byte)uVar26 | (byte)uVar29;
      auVar111 = vblendmps_avx512vl(auVar112,auVar121);
      auVar113._0_4_ =
           (uint)(bVar59 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar106._0_4_;
      bVar61 = (bool)(bVar59 >> 1 & 1);
      auVar113._4_4_ = (uint)bVar61 * auVar111._4_4_ | (uint)!bVar61 * auVar106._4_4_;
      bVar61 = (bool)(bVar59 >> 2 & 1);
      auVar113._8_4_ = (uint)bVar61 * auVar111._8_4_ | (uint)!bVar61 * auVar106._8_4_;
      bVar61 = (bool)(bVar59 >> 3 & 1);
      auVar113._12_4_ = (uint)bVar61 * auVar111._12_4_ | (uint)!bVar61 * auVar106._12_4_;
      bVar61 = (bool)(bVar59 >> 4 & 1);
      auVar113._16_4_ = (uint)bVar61 * auVar111._16_4_ | (uint)!bVar61 * auVar106._16_4_;
      bVar61 = (bool)(bVar59 >> 5 & 1);
      auVar113._20_4_ = (uint)bVar61 * auVar111._20_4_ | (uint)!bVar61 * auVar106._20_4_;
      bVar61 = (bool)(bVar59 >> 6 & 1);
      auVar113._24_4_ = (uint)bVar61 * auVar111._24_4_ | (uint)!bVar61 * auVar106._24_4_;
      auVar113._28_4_ =
           (uint)(bVar59 >> 7) * auVar111._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar106._28_4_;
      local_3a0 = vmaxps_avx(auVar115,auVar113);
      uVar29 = vcmpps_avx512vl(auVar103,auVar98,6);
      bVar59 = (byte)uVar26 | (byte)uVar29;
      auVar128._0_4_ = (uint)(bVar59 & 1) * 0x7f800000 | (uint)!(bool)(bVar59 & 1) * (int)fVar153;
      bVar61 = (bool)(bVar59 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar171;
      bVar61 = (bool)(bVar59 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar172;
      bVar61 = (bool)(bVar59 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar173;
      bVar61 = (bool)(bVar59 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar175;
      bVar61 = (bool)(bVar59 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar174;
      bVar61 = (bool)(bVar59 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar61 * 0x7f800000 | (uint)!bVar61 * (int)fVar176;
      auVar128._28_4_ =
           (uint)(bVar59 >> 7) * 0x7f800000 | (uint)!(bool)(bVar59 >> 7) * auVar104._28_4_;
      local_2a0 = vminps_avx(auVar105,auVar128);
      uVar26 = vcmpps_avx512vl(local_3a0,local_2a0,2);
      bVar54 = bVar54 & 0x7f & (byte)uVar26;
      if (bVar54 == 0) {
        auVar260 = ZEXT3264(local_800);
        goto LAB_0190888c;
      }
      auVar103 = vmaxps_avx512vl(auVar114,local_720);
      auVar98 = vfmadd213ps_avx512vl(local_4c0,auVar119,auVar102);
      fVar153 = auVar96._0_4_;
      fVar171 = auVar96._4_4_;
      auVar44._4_4_ = fVar171 * auVar98._4_4_;
      auVar44._0_4_ = fVar153 * auVar98._0_4_;
      fVar172 = auVar96._8_4_;
      auVar44._8_4_ = fVar172 * auVar98._8_4_;
      fVar173 = auVar96._12_4_;
      auVar44._12_4_ = fVar173 * auVar98._12_4_;
      fVar175 = auVar96._16_4_;
      auVar44._16_4_ = fVar175 * auVar98._16_4_;
      fVar174 = auVar96._20_4_;
      auVar44._20_4_ = fVar174 * auVar98._20_4_;
      fVar176 = auVar96._24_4_;
      auVar44._24_4_ = fVar176 * auVar98._24_4_;
      auVar44._28_4_ = auVar98._28_4_;
      auVar98 = vfmadd213ps_avx512vl(local_500,auVar119,auVar102);
      auVar45._4_4_ = fVar171 * auVar98._4_4_;
      auVar45._0_4_ = fVar153 * auVar98._0_4_;
      auVar45._8_4_ = fVar172 * auVar98._8_4_;
      auVar45._12_4_ = fVar173 * auVar98._12_4_;
      auVar45._16_4_ = fVar175 * auVar98._16_4_;
      auVar45._20_4_ = fVar174 * auVar98._20_4_;
      auVar45._24_4_ = fVar176 * auVar98._24_4_;
      auVar45._28_4_ = auVar98._28_4_;
      auVar98 = vminps_avx512vl(auVar44,auVar125);
      auVar51 = ZEXT812(0);
      auVar104 = ZEXT1232(auVar51) << 0x20;
      auVar98 = vmaxps_avx(auVar98,ZEXT1232(auVar51) << 0x20);
      auVar105 = vminps_avx512vl(auVar45,auVar125);
      auVar46._4_4_ = (auVar98._4_4_ + 1.0) * 0.125;
      auVar46._0_4_ = (auVar98._0_4_ + 0.0) * 0.125;
      auVar46._8_4_ = (auVar98._8_4_ + 2.0) * 0.125;
      auVar46._12_4_ = (auVar98._12_4_ + 3.0) * 0.125;
      auVar46._16_4_ = (auVar98._16_4_ + 4.0) * 0.125;
      auVar46._20_4_ = (auVar98._20_4_ + 5.0) * 0.125;
      auVar46._24_4_ = (auVar98._24_4_ + 6.0) * 0.125;
      auVar46._28_4_ = auVar98._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar46,local_700,local_860);
      auVar98 = vmaxps_avx(auVar105,ZEXT1232(auVar51) << 0x20);
      auVar47._4_4_ = (auVar98._4_4_ + 1.0) * 0.125;
      auVar47._0_4_ = (auVar98._0_4_ + 0.0) * 0.125;
      auVar47._8_4_ = (auVar98._8_4_ + 2.0) * 0.125;
      auVar47._12_4_ = (auVar98._12_4_ + 3.0) * 0.125;
      auVar47._16_4_ = (auVar98._16_4_ + 4.0) * 0.125;
      auVar47._20_4_ = (auVar98._20_4_ + 5.0) * 0.125;
      auVar47._24_4_ = (auVar98._24_4_ + 6.0) * 0.125;
      auVar47._28_4_ = auVar98._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar47,local_700,local_860);
      auVar48._4_4_ = auVar103._4_4_ * auVar103._4_4_;
      auVar48._0_4_ = auVar103._0_4_ * auVar103._0_4_;
      auVar48._8_4_ = auVar103._8_4_ * auVar103._8_4_;
      auVar48._12_4_ = auVar103._12_4_ * auVar103._12_4_;
      auVar48._16_4_ = auVar103._16_4_ * auVar103._16_4_;
      auVar48._20_4_ = auVar103._20_4_ * auVar103._20_4_;
      auVar48._24_4_ = auVar103._24_4_ * auVar103._24_4_;
      auVar48._28_4_ = auVar103._28_4_;
      auVar98 = vsubps_avx(auVar118,auVar48);
      auVar118._4_4_ = auVar98._4_4_ * (float)local_4a0._4_4_;
      auVar118._0_4_ = auVar98._0_4_ * (float)local_4a0._0_4_;
      auVar118._8_4_ = auVar98._8_4_ * fStack_498;
      auVar118._12_4_ = auVar98._12_4_ * fStack_494;
      auVar118._16_4_ = auVar98._16_4_ * fStack_490;
      auVar118._20_4_ = auVar98._20_4_ * fStack_48c;
      auVar118._24_4_ = auVar98._24_4_ * fStack_488;
      auVar118._28_4_ = auVar103._28_4_;
      auVar103 = vsubps_avx(local_7e0,auVar118);
      uVar26 = vcmpps_avx512vl(auVar103,ZEXT1232(auVar51) << 0x20,5);
      bVar59 = (byte)uVar26;
      auVar260 = ZEXT3264(local_800);
      auVar258 = ZEXT3264(local_880);
      if (bVar59 == 0) {
        bVar59 = 0;
        auVar96 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar100 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar105 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar106 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar103 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar119._8_4_ = 0x7f800000;
        auVar119._0_8_ = 0x7f8000007f800000;
        auVar119._12_4_ = 0x7f800000;
        auVar119._16_4_ = 0x7f800000;
        auVar119._20_4_ = 0x7f800000;
        auVar119._24_4_ = 0x7f800000;
        auVar119._28_4_ = 0x7f800000;
        auVar120._8_4_ = 0xff800000;
        auVar120._0_8_ = 0xff800000ff800000;
        auVar120._12_4_ = 0xff800000;
        auVar120._16_4_ = 0xff800000;
        auVar120._20_4_ = 0xff800000;
        auVar120._24_4_ = 0xff800000;
        auVar120._28_4_ = 0xff800000;
      }
      else {
        auVar83 = vxorps_avx512vl(auVar203,auVar203);
        uVar64 = vcmpps_avx512vl(auVar103,auVar114,5);
        auVar103 = vsqrtps_avx(auVar103);
        auVar104 = vfnmadd213ps_avx512vl(local_640,local_660,auVar125);
        auVar84 = vfmadd132ps_fma(auVar104,local_660,local_660);
        auVar104 = vsubps_avx(local_4e0,auVar103);
        auVar49._4_4_ = auVar84._4_4_ * auVar104._4_4_;
        auVar49._0_4_ = auVar84._0_4_ * auVar104._0_4_;
        auVar49._8_4_ = auVar84._8_4_ * auVar104._8_4_;
        auVar49._12_4_ = auVar84._12_4_ * auVar104._12_4_;
        auVar49._16_4_ = auVar104._16_4_ * 0.0;
        auVar49._20_4_ = auVar104._20_4_ * 0.0;
        auVar49._24_4_ = auVar104._24_4_ * 0.0;
        auVar49._28_4_ = 0x3e000000;
        auVar103 = vsubps_avx512vl(auVar103,auVar120);
        auVar50._4_4_ = auVar84._4_4_ * auVar103._4_4_;
        auVar50._0_4_ = auVar84._0_4_ * auVar103._0_4_;
        auVar50._8_4_ = auVar84._8_4_ * auVar103._8_4_;
        auVar50._12_4_ = auVar84._12_4_ * auVar103._12_4_;
        auVar50._16_4_ = auVar103._16_4_ * 0.0;
        auVar50._20_4_ = auVar103._20_4_ * 0.0;
        auVar50._24_4_ = auVar103._24_4_ * 0.0;
        auVar50._28_4_ = local_860._0_4_;
        auVar103 = vfmadd213ps_avx512vl(auVar119,auVar49,auVar102);
        auVar242._0_4_ = fVar153 * auVar103._0_4_;
        auVar242._4_4_ = fVar171 * auVar103._4_4_;
        auVar242._8_4_ = fVar172 * auVar103._8_4_;
        auVar242._12_4_ = fVar173 * auVar103._12_4_;
        auVar242._16_4_ = fVar175 * auVar103._16_4_;
        auVar242._20_4_ = fVar174 * auVar103._20_4_;
        auVar242._24_4_ = fVar176 * auVar103._24_4_;
        auVar242._28_4_ = 0;
        auVar103 = vmulps_avx512vl(local_6a0,auVar49);
        auVar104 = vmulps_avx512vl(local_2e0,auVar49);
        auVar111 = vmulps_avx512vl(local_6c0,auVar49);
        auVar105 = vfmadd213ps_avx512vl(auVar100,auVar242,auVar216);
        auVar105 = vsubps_avx512vl(auVar103,auVar105);
        auVar103 = vfmadd213ps_avx512vl(auVar101,auVar242,auVar107);
        auVar106 = vsubps_avx512vl(auVar104,auVar103);
        auVar84 = vfmadd213ps_fma(auVar242,auVar99,auVar110);
        auVar103 = vsubps_avx(auVar111,ZEXT1632(auVar84));
        auVar102 = vfmadd213ps_avx512vl(auVar119,auVar50,auVar102);
        auVar102 = vmulps_avx512vl(auVar96,auVar102);
        auVar254 = ZEXT3264(auVar102);
        auVar96 = vmulps_avx512vl(local_6a0,auVar50);
        auVar111 = vmulps_avx512vl(local_2e0,auVar50);
        auVar108 = vmulps_avx512vl(local_6c0,auVar50);
        auVar84 = vfmadd213ps_fma(auVar100,auVar102,auVar216);
        auVar104 = vsubps_avx(auVar96,ZEXT1632(auVar84));
        auVar84 = vfmadd213ps_fma(auVar101,auVar102,auVar107);
        auVar96 = vsubps_avx512vl(auVar111,ZEXT1632(auVar84));
        auVar84 = vfmadd213ps_fma(auVar99,auVar102,auVar110);
        auVar100 = vsubps_avx512vl(auVar108,ZEXT1632(auVar84));
        auVar197._8_4_ = 0x7f800000;
        auVar197._0_8_ = 0x7f8000007f800000;
        auVar197._12_4_ = 0x7f800000;
        auVar197._16_4_ = 0x7f800000;
        auVar197._20_4_ = 0x7f800000;
        auVar197._24_4_ = 0x7f800000;
        auVar197._28_4_ = 0x7f800000;
        auVar101 = vblendmps_avx512vl(auVar197,auVar49);
        bVar61 = (bool)((byte)uVar64 & 1);
        auVar119._0_4_ = (uint)bVar61 * auVar101._0_4_ | (uint)!bVar61 * auVar76._0_4_;
        bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar119._4_4_ = (uint)bVar61 * auVar101._4_4_ | (uint)!bVar61 * auVar76._4_4_;
        bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar119._8_4_ = (uint)bVar61 * auVar101._8_4_ | (uint)!bVar61 * auVar76._8_4_;
        bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar119._12_4_ = (uint)bVar61 * auVar101._12_4_ | (uint)!bVar61 * auVar76._12_4_;
        iVar1 = (uint)((byte)(uVar64 >> 4) & 1) * auVar101._16_4_;
        auVar119._16_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar64 >> 5) & 1) * auVar101._20_4_;
        auVar119._20_4_ = iVar2;
        iVar3 = (uint)((byte)(uVar64 >> 6) & 1) * auVar101._24_4_;
        auVar119._24_4_ = iVar3;
        iVar4 = (uint)(byte)(uVar64 >> 7) * auVar101._28_4_;
        auVar119._28_4_ = iVar4;
        auVar198._8_4_ = 0xff800000;
        auVar198._0_8_ = 0xff800000ff800000;
        auVar198._12_4_ = 0xff800000;
        auVar198._16_4_ = 0xff800000;
        auVar198._20_4_ = 0xff800000;
        auVar198._24_4_ = 0xff800000;
        auVar198._28_4_ = 0xff800000;
        auVar101 = vblendmps_avx512vl(auVar198,auVar50);
        bVar61 = (bool)((byte)uVar64 & 1);
        auVar120._0_4_ = (uint)bVar61 * auVar101._0_4_ | (uint)!bVar61 * -0x800000;
        bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar61 * auVar101._4_4_ | (uint)!bVar61 * -0x800000;
        bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar61 * auVar101._8_4_ | (uint)!bVar61 * -0x800000;
        bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar61 * auVar101._12_4_ | (uint)!bVar61 * -0x800000;
        bVar61 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar120._16_4_ = (uint)bVar61 * auVar101._16_4_ | (uint)!bVar61 * -0x800000;
        bVar61 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar120._20_4_ = (uint)bVar61 * auVar101._20_4_ | (uint)!bVar61 * -0x800000;
        bVar61 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar120._24_4_ = (uint)bVar61 * auVar101._24_4_ | (uint)!bVar61 * -0x800000;
        bVar61 = SUB81(uVar64 >> 7,0);
        auVar120._28_4_ = (uint)bVar61 * auVar101._28_4_ | (uint)!bVar61 * -0x800000;
        auVar216._8_4_ = 0x36000000;
        auVar216._0_8_ = 0x3600000036000000;
        auVar216._12_4_ = 0x36000000;
        auVar216._16_4_ = 0x36000000;
        auVar216._20_4_ = 0x36000000;
        auVar216._24_4_ = 0x36000000;
        auVar216._28_4_ = 0x36000000;
        auVar101 = vmulps_avx512vl(local_520,auVar216);
        uVar27 = vcmpps_avx512vl(auVar101,local_540,0xe);
        uVar64 = uVar64 & uVar27;
        bVar57 = (byte)uVar64;
        if (bVar57 != 0) {
          uVar27 = vcmpps_avx512vl(auVar98,ZEXT1632(auVar83),2);
          auVar238._8_4_ = 0x7f800000;
          auVar238._0_8_ = 0x7f8000007f800000;
          auVar238._12_4_ = 0x7f800000;
          auVar238._16_4_ = 0x7f800000;
          auVar238._20_4_ = 0x7f800000;
          auVar238._24_4_ = 0x7f800000;
          auVar238._28_4_ = 0x7f800000;
          auVar249._8_4_ = 0xff800000;
          auVar249._0_8_ = 0xff800000ff800000;
          auVar249._12_4_ = 0xff800000;
          auVar249._16_4_ = 0xff800000;
          auVar249._20_4_ = 0xff800000;
          auVar249._24_4_ = 0xff800000;
          auVar249._28_4_ = 0xff800000;
          auVar98 = vblendmps_avx512vl(auVar238,auVar249);
          bVar55 = (byte)uVar27;
          uVar65 = (uint)(bVar55 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar101._0_4_;
          bVar61 = (bool)((byte)(uVar27 >> 1) & 1);
          uVar132 = (uint)bVar61 * auVar98._4_4_ | (uint)!bVar61 * auVar101._4_4_;
          bVar61 = (bool)((byte)(uVar27 >> 2) & 1);
          uVar133 = (uint)bVar61 * auVar98._8_4_ | (uint)!bVar61 * auVar101._8_4_;
          bVar61 = (bool)((byte)(uVar27 >> 3) & 1);
          uVar134 = (uint)bVar61 * auVar98._12_4_ | (uint)!bVar61 * auVar101._12_4_;
          bVar61 = (bool)((byte)(uVar27 >> 4) & 1);
          uVar135 = (uint)bVar61 * auVar98._16_4_ | (uint)!bVar61 * auVar101._16_4_;
          bVar61 = (bool)((byte)(uVar27 >> 5) & 1);
          uVar136 = (uint)bVar61 * auVar98._20_4_ | (uint)!bVar61 * auVar101._20_4_;
          bVar61 = (bool)((byte)(uVar27 >> 6) & 1);
          uVar137 = (uint)bVar61 * auVar98._24_4_ | (uint)!bVar61 * auVar101._24_4_;
          bVar61 = SUB81(uVar27 >> 7,0);
          uVar138 = (uint)bVar61 * auVar98._28_4_ | (uint)!bVar61 * auVar101._28_4_;
          auVar119._0_4_ = (bVar57 & 1) * uVar65 | !(bool)(bVar57 & 1) * auVar119._0_4_;
          bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar119._4_4_ = bVar61 * uVar132 | !bVar61 * auVar119._4_4_;
          bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar119._8_4_ = bVar61 * uVar133 | !bVar61 * auVar119._8_4_;
          bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar119._12_4_ = bVar61 * uVar134 | !bVar61 * auVar119._12_4_;
          bVar61 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar119._16_4_ = bVar61 * uVar135 | (uint)!bVar61 * iVar1;
          bVar61 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar119._20_4_ = bVar61 * uVar136 | (uint)!bVar61 * iVar2;
          bVar61 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar119._24_4_ = bVar61 * uVar137 | (uint)!bVar61 * iVar3;
          bVar61 = SUB81(uVar64 >> 7,0);
          auVar119._28_4_ = bVar61 * uVar138 | (uint)!bVar61 * iVar4;
          auVar98 = vblendmps_avx512vl(auVar249,auVar238);
          bVar61 = (bool)((byte)(uVar27 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar27 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar27 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar27 >> 4) & 1);
          bVar18 = (bool)((byte)(uVar27 >> 5) & 1);
          bVar19 = (bool)((byte)(uVar27 >> 6) & 1);
          bVar20 = SUB81(uVar27 >> 7,0);
          auVar120._0_4_ =
               (uint)(bVar57 & 1) *
               ((uint)(bVar55 & 1) * auVar98._0_4_ | !(bool)(bVar55 & 1) * uVar65) |
               !(bool)(bVar57 & 1) * auVar120._0_4_;
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar120._4_4_ =
               (uint)bVar14 * ((uint)bVar61 * auVar98._4_4_ | !bVar61 * uVar132) |
               !bVar14 * auVar120._4_4_;
          bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar120._8_4_ =
               (uint)bVar61 * ((uint)bVar15 * auVar98._8_4_ | !bVar15 * uVar133) |
               !bVar61 * auVar120._8_4_;
          bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar120._12_4_ =
               (uint)bVar61 * ((uint)bVar16 * auVar98._12_4_ | !bVar16 * uVar134) |
               !bVar61 * auVar120._12_4_;
          bVar61 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar120._16_4_ =
               (uint)bVar61 * ((uint)bVar17 * auVar98._16_4_ | !bVar17 * uVar135) |
               !bVar61 * auVar120._16_4_;
          bVar61 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar120._20_4_ =
               (uint)bVar61 * ((uint)bVar18 * auVar98._20_4_ | !bVar18 * uVar136) |
               !bVar61 * auVar120._20_4_;
          bVar61 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar120._24_4_ =
               (uint)bVar61 * ((uint)bVar19 * auVar98._24_4_ | !bVar19 * uVar137) |
               !bVar61 * auVar120._24_4_;
          bVar61 = SUB81(uVar64 >> 7,0);
          auVar120._28_4_ =
               (uint)bVar61 * ((uint)bVar20 * auVar98._28_4_ | !bVar20 * uVar138) |
               !bVar61 * auVar120._28_4_;
          bVar59 = (~bVar57 | bVar55) & bVar59;
        }
      }
      auVar98 = vmovdqa64_avx512vl(auVar87);
      auVar255 = ZEXT3264(auVar98);
      auVar98 = vmovdqa64_avx512vl(auVar88);
      auVar256 = ZEXT3264(auVar98);
      auVar259 = ZEXT3264(local_6c0);
      auVar98 = vmulps_avx512vl(local_6c0,auVar100);
      auVar98 = vfmadd231ps_avx512vl(auVar98,local_2e0,auVar96);
      auVar257 = ZEXT3264(local_6a0);
      auVar98 = vfmadd231ps_avx512vl(auVar98,local_6a0,auVar104);
      _local_200 = local_3a0;
      local_1e0 = vminps_avx(local_2a0,auVar119);
      auVar236._8_4_ = 0x7fffffff;
      auVar236._0_8_ = 0x7fffffff7fffffff;
      auVar236._12_4_ = 0x7fffffff;
      auVar236._16_4_ = 0x7fffffff;
      auVar236._20_4_ = 0x7fffffff;
      auVar236._24_4_ = 0x7fffffff;
      auVar236._28_4_ = 0x7fffffff;
      auVar98 = vandps_avx(auVar98,auVar236);
      _local_2c0 = vmaxps_avx(local_3a0,auVar120);
      auVar233._8_4_ = 0x3e99999a;
      auVar233._0_8_ = 0x3e99999a3e99999a;
      auVar233._12_4_ = 0x3e99999a;
      auVar233._16_4_ = 0x3e99999a;
      auVar233._20_4_ = 0x3e99999a;
      auVar233._24_4_ = 0x3e99999a;
      auVar233._28_4_ = 0x3e99999a;
      uVar26 = vcmpps_avx512vl(auVar98,auVar233,1);
      uVar29 = vcmpps_avx512vl(local_3a0,local_1e0,2);
      bVar57 = (byte)uVar29 & bVar54;
      uVar28 = vcmpps_avx512vl(_local_2c0,local_2a0,2);
      if ((bVar54 & ((byte)uVar28 | (byte)uVar29)) == 0) {
        auVar227 = ZEXT3264(_DAT_01f7b040);
        auVar243 = ZEXT3264(local_780);
        auVar237 = ZEXT3264(local_740);
        auVar239 = ZEXT3264(local_7a0);
        auVar217 = ZEXT3264(local_680);
        auVar234 = ZEXT3264(local_760);
      }
      else {
        _local_360 = _local_2c0;
        local_890 = (uint)(byte)((byte)uVar26 | ~bVar59);
        auVar98 = vmulps_avx512vl(local_6c0,auVar103);
        auVar84 = vfmadd213ps_fma(auVar106,local_2e0,auVar98);
        auVar98 = vfmadd213ps_avx512vl(auVar105,local_6a0,ZEXT1632(auVar84));
        auVar98 = vandps_avx(auVar98,auVar236);
        uVar26 = vcmpps_avx512vl(auVar98,auVar233,1);
        bVar59 = (byte)uVar26 | ~bVar59;
        auVar148._8_4_ = 2;
        auVar148._0_8_ = 0x200000002;
        auVar148._12_4_ = 2;
        auVar148._16_4_ = 2;
        auVar148._20_4_ = 2;
        auVar148._24_4_ = 2;
        auVar148._28_4_ = 2;
        auVar41._8_4_ = 3;
        auVar41._0_8_ = 0x300000003;
        auVar41._12_4_ = 3;
        auVar41._16_4_ = 3;
        auVar41._20_4_ = 3;
        auVar41._24_4_ = 3;
        auVar41._28_4_ = 3;
        auVar98 = vpblendmd_avx512vl(auVar148,auVar41);
        local_280._0_4_ = (uint)(bVar59 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar59 & 1) * 2;
        bVar61 = (bool)(bVar59 >> 1 & 1);
        local_280._4_4_ = (uint)bVar61 * auVar98._4_4_ | (uint)!bVar61 * 2;
        bVar61 = (bool)(bVar59 >> 2 & 1);
        local_280._8_4_ = (uint)bVar61 * auVar98._8_4_ | (uint)!bVar61 * 2;
        bVar61 = (bool)(bVar59 >> 3 & 1);
        local_280._12_4_ = (uint)bVar61 * auVar98._12_4_ | (uint)!bVar61 * 2;
        bVar61 = (bool)(bVar59 >> 4 & 1);
        local_280._16_4_ = (uint)bVar61 * auVar98._16_4_ | (uint)!bVar61 * 2;
        bVar61 = (bool)(bVar59 >> 5 & 1);
        local_280._20_4_ = (uint)bVar61 * auVar98._20_4_ | (uint)!bVar61 * 2;
        bVar61 = (bool)(bVar59 >> 6 & 1);
        local_280._24_4_ = (uint)bVar61 * auVar98._24_4_ | (uint)!bVar61 * 2;
        local_280._28_4_ = (uint)(bVar59 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar59 >> 7) * 2;
        local_300 = vpbroadcastd_avx512vl();
        uVar26 = vpcmpd_avx512vl(local_300,local_280,5);
        local_88c = (uint)bVar57;
        local_340 = local_3a0._0_4_ + (float)local_380._0_4_;
        fStack_33c = local_3a0._4_4_ + (float)local_380._4_4_;
        fStack_338 = local_3a0._8_4_ + fStack_378;
        fStack_334 = local_3a0._12_4_ + fStack_374;
        fStack_330 = local_3a0._16_4_ + fStack_370;
        fStack_32c = local_3a0._20_4_ + fStack_36c;
        fStack_328 = local_3a0._24_4_ + fStack_368;
        fStack_324 = local_3a0._28_4_ + fStack_364;
        for (bVar57 = (byte)uVar26 & bVar57; auVar98 = local_860, bVar57 != 0;
            bVar57 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar57 & (byte)uVar26) {
          auVar149._8_4_ = 0x7f800000;
          auVar149._0_8_ = 0x7f8000007f800000;
          auVar149._12_4_ = 0x7f800000;
          auVar149._16_4_ = 0x7f800000;
          auVar149._20_4_ = 0x7f800000;
          auVar149._24_4_ = 0x7f800000;
          auVar149._28_4_ = 0x7f800000;
          auVar96 = vblendmps_avx512vl(auVar149,local_3a0);
          auVar130._0_4_ =
               (uint)(bVar57 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar57 & 1) * 0x7f800000;
          bVar61 = (bool)(bVar57 >> 1 & 1);
          auVar130._4_4_ = (uint)bVar61 * auVar96._4_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)(bVar57 >> 2 & 1);
          auVar130._8_4_ = (uint)bVar61 * auVar96._8_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)(bVar57 >> 3 & 1);
          auVar130._12_4_ = (uint)bVar61 * auVar96._12_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)(bVar57 >> 4 & 1);
          auVar130._16_4_ = (uint)bVar61 * auVar96._16_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)(bVar57 >> 5 & 1);
          auVar130._20_4_ = (uint)bVar61 * auVar96._20_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)(bVar57 >> 6 & 1);
          auVar130._24_4_ = (uint)bVar61 * auVar96._24_4_ | (uint)!bVar61 * 0x7f800000;
          auVar130._28_4_ =
               (uint)(bVar57 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar57 >> 7) * 0x7f800000;
          auVar96 = vshufps_avx(auVar130,auVar130,0xb1);
          auVar96 = vminps_avx(auVar130,auVar96);
          auVar100 = vshufpd_avx(auVar96,auVar96,5);
          auVar96 = vminps_avx(auVar96,auVar100);
          auVar100 = vpermpd_avx2(auVar96,0x4e);
          auVar96 = vminps_avx(auVar96,auVar100);
          uVar26 = vcmpps_avx512vl(auVar130,auVar96,0);
          bVar55 = (byte)uVar26 & bVar57;
          bVar59 = bVar57;
          if (bVar55 != 0) {
            bVar59 = bVar55;
          }
          iVar2 = 0;
          for (uVar65 = (uint)bVar59; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
            iVar2 = iVar2 + 1;
          }
          fVar153 = *(float *)(local_1a0 + (uint)(iVar2 << 2));
          auVar217 = ZEXT464(*(uint *)(local_200 + (uint)(iVar2 << 2)));
          fVar171 = local_888;
          if ((float)local_6e0._0_4_ < 0.0) {
            local_7e0._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar2 << 2)));
            local_860[1] = 0;
            local_860[0] = bVar57;
            local_860._2_30_ = auVar98._2_30_;
            auVar254 = ZEXT1664(auVar254._0_16_);
            fVar171 = sqrtf((float)local_6e0._0_4_);
            bVar57 = local_860[0];
            auVar217 = ZEXT1664(local_7e0._0_16_);
            auVar258 = ZEXT3264(local_880);
            auVar98 = vmovdqa64_avx512vl(auVar88);
            auVar256 = ZEXT3264(auVar98);
            auVar98 = vmovdqa64_avx512vl(auVar87);
            auVar255 = ZEXT3264(auVar98);
            auVar260 = ZEXT3264(local_800);
          }
          auVar83 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar84 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar85 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar79 = vminps_avx(auVar83,auVar85);
          auVar83 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar85 = vmaxps_avx(auVar84,auVar83);
          auVar204._8_4_ = 0x7fffffff;
          auVar204._0_8_ = 0x7fffffff7fffffff;
          auVar204._12_4_ = 0x7fffffff;
          auVar84 = vandps_avx(auVar79,auVar204);
          auVar83 = vandps_avx(auVar85,auVar204);
          auVar84 = vmaxps_avx(auVar84,auVar83);
          auVar83 = vmovshdup_avx(auVar84);
          auVar83 = vmaxss_avx(auVar83,auVar84);
          auVar84 = vshufpd_avx(auVar84,auVar84,1);
          auVar84 = vmaxss_avx(auVar84,auVar83);
          local_520._0_4_ = auVar84._0_4_ * 1.9073486e-06;
          local_540._0_4_ = fVar171 * 1.9073486e-06;
          local_610 = vshufps_avx(auVar85,auVar85,0xff);
          lVar60 = 5;
          do {
            do {
              bVar61 = lVar60 == 0;
              lVar60 = lVar60 + -1;
              if (bVar61) goto LAB_01909435;
              uVar154 = auVar217._0_4_;
              auVar141._4_4_ = uVar154;
              auVar141._0_4_ = uVar154;
              auVar141._8_4_ = uVar154;
              auVar141._12_4_ = uVar154;
              auVar83 = vfmadd132ps_fma(auVar141,ZEXT816(0) << 0x40,local_6d0);
              fVar171 = 1.0 - fVar153;
              auVar179._0_4_ = local_5a0._0_4_ * fVar153;
              auVar179._4_4_ = local_5a0._4_4_ * fVar153;
              auVar179._8_4_ = local_5a0._8_4_ * fVar153;
              auVar179._12_4_ = local_5a0._12_4_ * fVar153;
              local_4c0._0_16_ = ZEXT416((uint)fVar171);
              auVar205._4_4_ = fVar171;
              auVar205._0_4_ = fVar171;
              auVar205._8_4_ = fVar171;
              auVar205._12_4_ = fVar171;
              auVar84 = vfmadd231ps_fma(auVar179,auVar205,local_560._0_16_);
              auVar210._0_4_ = local_580._0_4_ * fVar153;
              auVar210._4_4_ = local_580._4_4_ * fVar153;
              auVar210._8_4_ = local_580._8_4_ * fVar153;
              auVar210._12_4_ = local_580._12_4_ * fVar153;
              auVar85 = vfmadd231ps_fma(auVar210,auVar205,local_5a0._0_16_);
              auVar222._0_4_ = fVar153 * (float)local_5c0._0_4_;
              auVar222._4_4_ = fVar153 * (float)local_5c0._4_4_;
              auVar222._8_4_ = fVar153 * fStack_5b8;
              auVar222._12_4_ = fVar153 * fStack_5b4;
              auVar79 = vfmadd231ps_fma(auVar222,auVar205,local_580._0_16_);
              auVar229._0_4_ = fVar153 * auVar85._0_4_;
              auVar229._4_4_ = fVar153 * auVar85._4_4_;
              auVar229._8_4_ = fVar153 * auVar85._8_4_;
              auVar229._12_4_ = fVar153 * auVar85._12_4_;
              auVar84 = vfmadd231ps_fma(auVar229,auVar205,auVar84);
              auVar180._0_4_ = fVar153 * auVar79._0_4_;
              auVar180._4_4_ = fVar153 * auVar79._4_4_;
              auVar180._8_4_ = fVar153 * auVar79._8_4_;
              auVar180._12_4_ = fVar153 * auVar79._12_4_;
              auVar85 = vfmadd231ps_fma(auVar180,auVar205,auVar85);
              auVar211._0_4_ = fVar153 * auVar85._0_4_;
              auVar211._4_4_ = fVar153 * auVar85._4_4_;
              auVar211._8_4_ = fVar153 * auVar85._8_4_;
              auVar211._12_4_ = fVar153 * auVar85._12_4_;
              auVar79 = vfmadd231ps_fma(auVar211,auVar84,auVar205);
              auVar84 = vsubps_avx(auVar85,auVar84);
              auVar30._8_4_ = 0x40400000;
              auVar30._0_8_ = 0x4040000040400000;
              auVar30._12_4_ = 0x40400000;
              auVar85 = vmulps_avx512vl(auVar84,auVar30);
              _local_4a0 = auVar79;
              auVar83 = vsubps_avx(auVar83,auVar79);
              auVar84 = vdpps_avx(auVar83,auVar83,0x7f);
              local_a00 = ZEXT416((uint)fVar153);
              local_7e0._0_16_ = auVar217._0_16_;
              local_860._0_16_ = auVar85;
              local_700._0_16_ = auVar83;
              local_720._0_16_ = auVar84;
              if (auVar84._0_4_ < 0.0) {
                auVar227._0_4_ = sqrtf(auVar84._0_4_);
                auVar227._4_60_ = extraout_var;
                auVar84 = auVar227._0_16_;
                auVar85 = local_860._0_16_;
              }
              else {
                auVar84 = vsqrtss_avx(auVar84,auVar84);
              }
              local_660._0_16_ = vdpps_avx(auVar85,auVar85,0x7f);
              fVar171 = local_660._0_4_;
              auVar181._4_12_ = ZEXT812(0) << 0x20;
              auVar181._0_4_ = fVar171;
              auVar79 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar181);
              local_4e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar181);
              auVar31._8_4_ = 0x80000000;
              auVar31._0_8_ = 0x8000000080000000;
              auVar31._12_4_ = 0x80000000;
              auVar86 = vxorps_avx512vl(local_660._0_16_,auVar31);
              auVar83 = vfnmadd213ss_fma(local_4e0._0_16_,local_660._0_16_,ZEXT416(0x40000000));
              local_500._0_4_ = auVar83._0_4_;
              local_640._0_4_ = auVar84._0_4_;
              if (fVar171 < auVar86._0_4_) {
                local_7c0 = auVar79;
                auVar234._0_4_ = sqrtf(fVar171);
                auVar234._4_60_ = extraout_var_00;
                auVar84 = ZEXT416((uint)local_640._0_4_);
                auVar86 = auVar234._0_16_;
                auVar83 = local_7c0;
                auVar85 = local_860._0_16_;
              }
              else {
                auVar86 = vsqrtss_avx512f(local_660._0_16_,local_660._0_16_);
                auVar83 = auVar79;
              }
              fVar172 = auVar83._0_4_;
              fVar171 = auVar79._0_4_ * 1.5 + fVar171 * -0.5 * fVar172 * fVar172 * fVar172;
              auVar230._0_4_ = auVar85._0_4_ * fVar171;
              auVar230._4_4_ = auVar85._4_4_ * fVar171;
              auVar230._8_4_ = auVar85._8_4_ * fVar171;
              auVar230._12_4_ = auVar85._12_4_ * fVar171;
              auVar83 = vdpps_avx(local_700._0_16_,auVar230,0x7f);
              fVar172 = auVar84._0_4_ + 1.0;
              fVar173 = auVar83._0_4_;
              auVar142._0_4_ = fVar173 * fVar173;
              auVar142._4_4_ = auVar83._4_4_ * auVar83._4_4_;
              auVar142._8_4_ = auVar83._8_4_ * auVar83._8_4_;
              auVar142._12_4_ = auVar83._12_4_ * auVar83._12_4_;
              auVar79 = vsubps_avx(local_720._0_16_,auVar142);
              fVar175 = auVar79._0_4_;
              auVar159._4_12_ = ZEXT812(0) << 0x20;
              auVar159._0_4_ = fVar175;
              auVar76 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar159);
              auVar75 = vmulss_avx512f(auVar76,ZEXT416(0x3fc00000));
              auVar72 = vmulss_avx512f(auVar79,ZEXT416(0xbf000000));
              if (fVar175 < 0.0) {
                local_7c0._0_4_ = fVar172;
                local_600 = fVar171;
                fStack_5fc = fVar171;
                fStack_5f8 = fVar171;
                fStack_5f4 = fVar171;
                local_5f0 = auVar230;
                local_5e0 = auVar76;
                fVar175 = sqrtf(fVar175);
                auVar72 = ZEXT416(auVar72._0_4_);
                auVar75 = ZEXT416(auVar75._0_4_);
                auVar86 = ZEXT416(auVar86._0_4_);
                auVar84 = ZEXT416((uint)local_640._0_4_);
                auVar230 = local_5f0;
                fVar172 = (float)local_7c0._0_4_;
                auVar85 = local_860._0_16_;
                auVar76 = local_5e0;
                fVar171 = local_600;
                fVar174 = fStack_5fc;
                fVar176 = fStack_5f8;
                fVar177 = fStack_5f4;
              }
              else {
                auVar79 = vsqrtss_avx(auVar79,auVar79);
                fVar175 = auVar79._0_4_;
                fVar174 = fVar171;
                fVar176 = fVar171;
                fVar177 = fVar171;
              }
              auVar254 = ZEXT1664(auVar83);
              auVar260 = ZEXT3264(local_800);
              auVar98 = vmovdqa64_avx512vl(auVar87);
              auVar255 = ZEXT3264(auVar98);
              auVar98 = vmovdqa64_avx512vl(auVar88);
              auVar256 = ZEXT3264(auVar98);
              auVar258 = ZEXT3264(local_880);
              auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a00,local_4c0._0_16_);
              fVar155 = auVar79._0_4_ * 6.0;
              fVar21 = fVar153 * 6.0;
              auVar182._0_4_ = fVar21 * (float)local_5c0._0_4_;
              auVar182._4_4_ = fVar21 * (float)local_5c0._4_4_;
              auVar182._8_4_ = fVar21 * fStack_5b8;
              auVar182._12_4_ = fVar21 * fStack_5b4;
              auVar160._4_4_ = fVar155;
              auVar160._0_4_ = fVar155;
              auVar160._8_4_ = fVar155;
              auVar160._12_4_ = fVar155;
              auVar79 = vfmadd132ps_fma(auVar160,auVar182,local_580._0_16_);
              auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4c0._0_16_,local_a00);
              fVar155 = auVar73._0_4_ * 6.0;
              auVar183._4_4_ = fVar155;
              auVar183._0_4_ = fVar155;
              auVar183._8_4_ = fVar155;
              auVar183._12_4_ = fVar155;
              auVar79 = vfmadd132ps_fma(auVar183,auVar79,local_5a0._0_16_);
              fVar155 = local_4c0._0_4_ * 6.0;
              auVar161._4_4_ = fVar155;
              auVar161._0_4_ = fVar155;
              auVar161._8_4_ = fVar155;
              auVar161._12_4_ = fVar155;
              auVar79 = vfmadd132ps_fma(auVar161,auVar79,local_560._0_16_);
              auVar184._0_4_ = auVar79._0_4_ * (float)local_660._0_4_;
              auVar184._4_4_ = auVar79._4_4_ * (float)local_660._0_4_;
              auVar184._8_4_ = auVar79._8_4_ * (float)local_660._0_4_;
              auVar184._12_4_ = auVar79._12_4_ * (float)local_660._0_4_;
              auVar79 = vdpps_avx(auVar85,auVar79,0x7f);
              fVar155 = auVar79._0_4_;
              auVar162._0_4_ = auVar85._0_4_ * fVar155;
              auVar162._4_4_ = auVar85._4_4_ * fVar155;
              auVar162._8_4_ = auVar85._8_4_ * fVar155;
              auVar162._12_4_ = auVar85._12_4_ * fVar155;
              auVar79 = vsubps_avx(auVar184,auVar162);
              fVar155 = (float)local_500._0_4_ * (float)local_4e0._0_4_;
              auVar32._8_4_ = 0x80000000;
              auVar32._0_8_ = 0x8000000080000000;
              auVar32._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(auVar85,auVar32);
              auVar212._0_4_ = fVar171 * auVar79._0_4_ * fVar155;
              auVar212._4_4_ = fVar174 * auVar79._4_4_ * fVar155;
              auVar212._8_4_ = fVar176 * auVar79._8_4_ * fVar155;
              auVar212._12_4_ = fVar177 * auVar79._12_4_ * fVar155;
              auVar79 = vdpps_avx(auVar77,auVar230,0x7f);
              auVar73 = vmaxss_avx(ZEXT416((uint)local_520._0_4_),
                                   ZEXT416((uint)((float)local_7e0._0_4_ * (float)local_540._0_4_)))
              ;
              auVar74 = vdivss_avx512f(ZEXT416((uint)local_520._0_4_),auVar86);
              auVar86 = vdpps_avx(local_700._0_16_,auVar212,0x7f);
              auVar84 = vfmadd213ss_fma(auVar84,ZEXT416((uint)local_520._0_4_),auVar73);
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)fVar172),auVar74,auVar84);
              auVar84 = vdpps_avx(local_6d0,auVar230,0x7f);
              fVar171 = auVar79._0_4_ + auVar86._0_4_;
              auVar79 = vdpps_avx(local_700._0_16_,auVar77,0x7f);
              auVar72 = vmulss_avx512f(auVar72,auVar76);
              auVar76 = vmulss_avx512f(auVar76,auVar76);
              auVar86 = vdpps_avx(local_700._0_16_,local_6d0,0x7f);
              auVar72 = vaddss_avx512f(auVar75,ZEXT416((uint)(auVar72._0_4_ * auVar76._0_4_)));
              auVar76 = vfnmadd231ss_fma(auVar79,auVar83,ZEXT416((uint)fVar171));
              auVar75 = vfnmadd231ss_fma(auVar86,auVar83,auVar84);
              auVar79 = vpermilps_avx(_local_4a0,0xff);
              fVar175 = fVar175 - auVar79._0_4_;
              auVar79 = vshufps_avx(auVar85,auVar85,0xff);
              auVar86 = vfmsub213ss_fma(auVar76,auVar72,auVar79);
              fVar172 = auVar75._0_4_ * auVar72._0_4_;
              auVar76 = vfmsub231ss_fma(ZEXT416((uint)(auVar84._0_4_ * auVar86._0_4_)),
                                        ZEXT416((uint)fVar171),ZEXT416((uint)fVar172));
              fVar174 = auVar76._0_4_;
              fVar153 = fVar153 - (fVar173 * (fVar172 / fVar174) -
                                  fVar175 * (auVar84._0_4_ / fVar174));
              fVar171 = (float)local_7e0._0_4_ -
                        (fVar175 * (fVar171 / fVar174) - fVar173 * (auVar86._0_4_ / fVar174));
              auVar217 = ZEXT464((uint)fVar171);
              auVar33._8_4_ = 0x7fffffff;
              auVar33._0_8_ = 0x7fffffff7fffffff;
              auVar33._12_4_ = 0x7fffffff;
              auVar84 = vandps_avx512vl(auVar83,auVar33);
            } while (auVar74._0_4_ <= auVar84._0_4_);
            auVar84 = vfmadd231ss_fma(ZEXT416((uint)(auVar74._0_4_ + auVar73._0_4_)),local_610,
                                      ZEXT416(0x36000000));
            auVar34._8_4_ = 0x7fffffff;
            auVar34._0_8_ = 0x7fffffff7fffffff;
            auVar34._12_4_ = 0x7fffffff;
            auVar86 = vandps_avx512vl(ZEXT416((uint)fVar175),auVar34);
          } while (auVar84._0_4_ <= auVar86._0_4_);
          fVar171 = fVar171 + (float)local_620._0_4_;
          if ((((fVar6 <= fVar171) && (fVar172 = *(float *)(ray + k * 4 + 0x80), fVar171 <= fVar172)
               ) && (0.0 <= fVar153)) && (fVar153 <= 1.0)) {
            auVar185._4_12_ = SUB1612(ZEXT816(0),0);
            auVar185._0_4_ = local_720._0_4_;
            auVar84 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar185);
            fVar173 = auVar84._0_4_;
            pGVar8 = (context->scene->geometries).items[uVar7].ptr;
            if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar173 = fVar173 * 1.5 + local_720._0_4_ * -0.5 * fVar173 * fVar173 * fVar173;
              auVar186._0_4_ = local_700._0_4_ * fVar173;
              auVar186._4_4_ = local_700._4_4_ * fVar173;
              auVar186._8_4_ = local_700._8_4_ * fVar173;
              auVar186._12_4_ = local_700._12_4_ * fVar173;
              auVar86 = vfmadd213ps_fma(auVar79,auVar186,auVar85);
              auVar84 = vshufps_avx(auVar186,auVar186,0xc9);
              auVar79 = vshufps_avx(auVar85,auVar85,0xc9);
              auVar187._0_4_ = auVar186._0_4_ * auVar79._0_4_;
              auVar187._4_4_ = auVar186._4_4_ * auVar79._4_4_;
              auVar187._8_4_ = auVar186._8_4_ * auVar79._8_4_;
              auVar187._12_4_ = auVar186._12_4_ * auVar79._12_4_;
              auVar79 = vfmsub231ps_fma(auVar187,auVar85,auVar84);
              auVar84 = vshufps_avx(auVar79,auVar79,0xc9);
              auVar85 = vshufps_avx(auVar86,auVar86,0xc9);
              auVar79 = vshufps_avx(auVar79,auVar79,0xd2);
              auVar143._0_4_ = auVar86._0_4_ * auVar79._0_4_;
              auVar143._4_4_ = auVar86._4_4_ * auVar79._4_4_;
              auVar143._8_4_ = auVar86._8_4_ * auVar79._8_4_;
              auVar143._12_4_ = auVar86._12_4_ * auVar79._12_4_;
              auVar84 = vfmsub231ps_fma(auVar143,auVar84,auVar85);
              uVar154 = auVar84._0_4_;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                *(float *)(ray + k * 4 + 0x80) = fVar171;
                uVar246 = vextractps_avx(auVar84,1);
                *(undefined4 *)(ray + k * 4 + 0xc0) = uVar246;
                uVar246 = vextractps_avx(auVar84,2);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar246;
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar154;
                *(float *)(ray + k * 4 + 0xf0) = fVar153;
                *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                *(int *)(ray + k * 4 + 0x110) = (int)local_7a8;
                *(uint *)(ray + k * 4 + 0x120) = uVar7;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_440 = (RTCHitN  [16])vshufps_avx(auVar84,auVar84,0x55);
                auStack_430 = vshufps_avx(auVar84,auVar84,0xaa);
                local_420 = uVar154;
                uStack_41c = uVar154;
                uStack_418 = uVar154;
                uStack_414 = uVar154;
                local_410 = fVar153;
                fStack_40c = fVar153;
                fStack_408 = fVar153;
                fStack_404 = fVar153;
                local_400 = ZEXT416(0) << 0x20;
                local_3f0 = local_460._0_8_;
                uStack_3e8 = local_460._8_8_;
                local_3e0 = local_450;
                vpcmpeqd_avx2(ZEXT1632(local_450),ZEXT1632(local_450));
                uStack_3cc = context->user->instID[0];
                local_3d0 = uStack_3cc;
                uStack_3c8 = uStack_3cc;
                uStack_3c4 = uStack_3cc;
                uStack_3c0 = context->user->instPrimID[0];
                uStack_3bc = uStack_3c0;
                uStack_3b8 = uStack_3c0;
                uStack_3b4 = uStack_3c0;
                *(float *)(ray + k * 4 + 0x80) = fVar171;
                local_8a0 = local_470;
                local_830.valid = (int *)local_8a0;
                local_830.geometryUserPtr = pGVar8->userPtr;
                local_830.context = context->user;
                local_830.hit = local_440;
                local_830.N = 4;
                local_830.ray = (RTCRayN *)ray;
                if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar254 = ZEXT1664(auVar83);
                  (*pGVar8->intersectionFilterN)(&local_830);
                  auVar258 = ZEXT3264(local_880);
                  auVar98 = vmovdqa64_avx512vl(auVar88);
                  auVar256 = ZEXT3264(auVar98);
                  auVar98 = vmovdqa64_avx512vl(auVar87);
                  auVar255 = ZEXT3264(auVar98);
                  auVar260 = ZEXT3264(local_800);
                }
                uVar64 = vptestmd_avx512vl(local_8a0,local_8a0);
                if ((uVar64 & 0xf) != 0) {
                  p_Var13 = context->args->filter;
                  if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar254 = ZEXT1664(auVar254._0_16_);
                    (*p_Var13)(&local_830);
                    auVar258 = ZEXT3264(local_880);
                    auVar98 = vmovdqa64_avx512vl(auVar88);
                    auVar256 = ZEXT3264(auVar98);
                    auVar98 = vmovdqa64_avx512vl(auVar87);
                    auVar255 = ZEXT3264(auVar98);
                    auVar260 = ZEXT3264(local_800);
                  }
                  uVar64 = vptestmd_avx512vl(local_8a0,local_8a0);
                  uVar64 = uVar64 & 0xf;
                  bVar59 = (byte)uVar64;
                  if (bVar59 != 0) {
                    iVar3 = *(int *)(local_830.hit + 4);
                    iVar4 = *(int *)(local_830.hit + 8);
                    iVar1 = *(int *)(local_830.hit + 0xc);
                    bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
                    bVar15 = SUB81(uVar64 >> 3,0);
                    *(uint *)(local_830.ray + 0xc0) =
                         (uint)(bVar59 & 1) * *(int *)local_830.hit |
                         (uint)!(bool)(bVar59 & 1) * *(int *)(local_830.ray + 0xc0);
                    *(uint *)(local_830.ray + 0xc4) =
                         (uint)bVar61 * iVar3 | (uint)!bVar61 * *(int *)(local_830.ray + 0xc4);
                    *(uint *)(local_830.ray + 200) =
                         (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_830.ray + 200);
                    *(uint *)(local_830.ray + 0xcc) =
                         (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_830.ray + 0xcc);
                    iVar3 = *(int *)(local_830.hit + 0x14);
                    iVar4 = *(int *)(local_830.hit + 0x18);
                    iVar1 = *(int *)(local_830.hit + 0x1c);
                    bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
                    bVar15 = SUB81(uVar64 >> 3,0);
                    *(uint *)(local_830.ray + 0xd0) =
                         (uint)(bVar59 & 1) * *(int *)(local_830.hit + 0x10) |
                         (uint)!(bool)(bVar59 & 1) * *(int *)(local_830.ray + 0xd0);
                    *(uint *)(local_830.ray + 0xd4) =
                         (uint)bVar61 * iVar3 | (uint)!bVar61 * *(int *)(local_830.ray + 0xd4);
                    *(uint *)(local_830.ray + 0xd8) =
                         (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_830.ray + 0xd8);
                    *(uint *)(local_830.ray + 0xdc) =
                         (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_830.ray + 0xdc);
                    iVar3 = *(int *)(local_830.hit + 0x24);
                    iVar4 = *(int *)(local_830.hit + 0x28);
                    iVar1 = *(int *)(local_830.hit + 0x2c);
                    bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
                    bVar15 = SUB81(uVar64 >> 3,0);
                    *(uint *)(local_830.ray + 0xe0) =
                         (uint)(bVar59 & 1) * *(int *)(local_830.hit + 0x20) |
                         (uint)!(bool)(bVar59 & 1) * *(int *)(local_830.ray + 0xe0);
                    *(uint *)(local_830.ray + 0xe4) =
                         (uint)bVar61 * iVar3 | (uint)!bVar61 * *(int *)(local_830.ray + 0xe4);
                    *(uint *)(local_830.ray + 0xe8) =
                         (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_830.ray + 0xe8);
                    *(uint *)(local_830.ray + 0xec) =
                         (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_830.ray + 0xec);
                    iVar3 = *(int *)(local_830.hit + 0x34);
                    iVar4 = *(int *)(local_830.hit + 0x38);
                    iVar1 = *(int *)(local_830.hit + 0x3c);
                    bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
                    bVar15 = SUB81(uVar64 >> 3,0);
                    *(uint *)(local_830.ray + 0xf0) =
                         (uint)(bVar59 & 1) * *(int *)(local_830.hit + 0x30) |
                         (uint)!(bool)(bVar59 & 1) * *(int *)(local_830.ray + 0xf0);
                    *(uint *)(local_830.ray + 0xf4) =
                         (uint)bVar61 * iVar3 | (uint)!bVar61 * *(int *)(local_830.ray + 0xf4);
                    *(uint *)(local_830.ray + 0xf8) =
                         (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_830.ray + 0xf8);
                    *(uint *)(local_830.ray + 0xfc) =
                         (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_830.ray + 0xfc);
                    iVar3 = *(int *)(local_830.hit + 0x44);
                    iVar4 = *(int *)(local_830.hit + 0x48);
                    iVar1 = *(int *)(local_830.hit + 0x4c);
                    bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
                    bVar15 = SUB81(uVar64 >> 3,0);
                    *(uint *)(local_830.ray + 0x100) =
                         (uint)(bVar59 & 1) * *(int *)(local_830.hit + 0x40) |
                         (uint)!(bool)(bVar59 & 1) * *(int *)(local_830.ray + 0x100);
                    *(uint *)(local_830.ray + 0x104) =
                         (uint)bVar61 * iVar3 | (uint)!bVar61 * *(int *)(local_830.ray + 0x104);
                    *(uint *)(local_830.ray + 0x108) =
                         (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_830.ray + 0x108);
                    *(uint *)(local_830.ray + 0x10c) =
                         (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_830.ray + 0x10c);
                    auVar84 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_830.hit + 0x50));
                    *(undefined1 (*) [16])(local_830.ray + 0x110) = auVar84;
                    auVar84 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_830.hit + 0x60));
                    *(undefined1 (*) [16])(local_830.ray + 0x120) = auVar84;
                    auVar84 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_830.hit + 0x70));
                    *(undefined1 (*) [16])(local_830.ray + 0x130) = auVar84;
                    auVar84 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_830.hit + 0x80));
                    *(undefined1 (*) [16])(local_830.ray + 0x140) = auVar84;
                    goto LAB_01909435;
                  }
                }
                *(float *)(ray + k * 4 + 0x80) = fVar172;
              }
            }
          }
LAB_01909435:
          uVar154 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar225._4_4_ = uVar154;
          auVar225._0_4_ = uVar154;
          auVar225._8_4_ = uVar154;
          auVar225._12_4_ = uVar154;
          auVar225._16_4_ = uVar154;
          auVar225._20_4_ = uVar154;
          auVar225._24_4_ = uVar154;
          auVar225._28_4_ = uVar154;
          auVar227 = ZEXT3264(auVar225);
          auVar52._4_4_ = fStack_33c;
          auVar52._0_4_ = local_340;
          auVar52._8_4_ = fStack_338;
          auVar52._12_4_ = fStack_334;
          auVar52._16_4_ = fStack_330;
          auVar52._20_4_ = fStack_32c;
          auVar52._24_4_ = fStack_328;
          auVar52._28_4_ = fStack_324;
          uVar26 = vcmpps_avx512vl(auVar225,auVar52,0xd);
          auVar257 = ZEXT3264(local_6a0);
          auVar259 = ZEXT3264(local_6c0);
        }
        auVar150._0_4_ = (float)local_380._0_4_ + (float)local_360._0_4_;
        auVar150._4_4_ = (float)local_380._4_4_ + (float)local_360._4_4_;
        auVar150._8_4_ = fStack_378 + fStack_358;
        auVar150._12_4_ = fStack_374 + fStack_354;
        auVar150._16_4_ = fStack_370 + fStack_350;
        auVar150._20_4_ = fStack_36c + fStack_34c;
        auVar150._24_4_ = fStack_368 + fStack_348;
        auVar150._28_4_ = fStack_364 + fStack_344;
        uVar154 = auVar227._0_4_;
        auVar169._4_4_ = uVar154;
        auVar169._0_4_ = uVar154;
        auVar169._8_4_ = uVar154;
        auVar169._12_4_ = uVar154;
        auVar169._16_4_ = uVar154;
        auVar169._20_4_ = uVar154;
        auVar169._24_4_ = uVar154;
        auVar169._28_4_ = uVar154;
        uVar26 = vcmpps_avx512vl(auVar150,auVar169,2);
        auVar151._8_4_ = 2;
        auVar151._0_8_ = 0x200000002;
        auVar151._12_4_ = 2;
        auVar151._16_4_ = 2;
        auVar151._20_4_ = 2;
        auVar151._24_4_ = 2;
        auVar151._28_4_ = 2;
        auVar42._8_4_ = 3;
        auVar42._0_8_ = 0x300000003;
        auVar42._12_4_ = 3;
        auVar42._16_4_ = 3;
        auVar42._20_4_ = 3;
        auVar42._24_4_ = 3;
        auVar42._28_4_ = 3;
        auVar98 = vpblendmd_avx512vl(auVar151,auVar42);
        bVar61 = (bool)((byte)local_890 & 1);
        local_360._0_4_ = (uint)bVar61 * auVar98._0_4_ | (uint)!bVar61 * 2;
        bVar61 = (bool)((byte)(local_890 >> 1) & 1);
        local_360._4_4_ = (uint)bVar61 * auVar98._4_4_ | (uint)!bVar61 * 2;
        bVar61 = (bool)((byte)(local_890 >> 2) & 1);
        fStack_358 = (float)((uint)bVar61 * auVar98._8_4_ | (uint)!bVar61 * 2);
        bVar61 = (bool)((byte)(local_890 >> 3) & 1);
        fStack_354 = (float)((uint)bVar61 * auVar98._12_4_ | (uint)!bVar61 * 2);
        bVar61 = (bool)((byte)(local_890 >> 4) & 1);
        fStack_350 = (float)((uint)bVar61 * auVar98._16_4_ | (uint)!bVar61 * 2);
        bVar61 = (bool)((byte)(local_890 >> 5) & 1);
        fStack_34c = (float)((uint)bVar61 * auVar98._20_4_ | (uint)!bVar61 * 2);
        bVar61 = (bool)((byte)(local_890 >> 6) & 1);
        fStack_348 = (float)((uint)bVar61 * auVar98._24_4_ | (uint)!bVar61 * 2);
        bVar61 = (bool)((byte)(local_890 >> 7) & 1);
        fStack_344 = (float)((uint)bVar61 * auVar98._28_4_ | (uint)!bVar61 * 2);
        bVar54 = (byte)uVar28 & bVar54 & (byte)uVar26;
        uVar26 = vpcmpd_avx512vl(_local_360,local_300,2);
        local_3a0 = _local_2c0;
        local_340 = (float)local_380._0_4_ + (float)local_2c0._0_4_;
        fStack_33c = (float)local_380._4_4_ + (float)local_2c0._4_4_;
        fStack_338 = fStack_378 + fStack_2b8;
        fStack_334 = fStack_374 + fStack_2b4;
        fStack_330 = fStack_370 + fStack_2b0;
        fStack_32c = fStack_36c + fStack_2ac;
        fStack_328 = fStack_368 + fStack_2a8;
        fStack_324 = fStack_364 + fStack_2a4;
        auVar243 = ZEXT3264(local_780);
        auVar237 = ZEXT3264(local_740);
        auVar239 = ZEXT3264(local_7a0);
        auVar234 = ZEXT3264(local_760);
        for (bVar59 = (byte)uVar26 & bVar54; auVar98 = local_860, auVar217 = ZEXT3264(local_680),
            bVar59 != 0; bVar59 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar59 & (byte)uVar26) {
          auVar152._8_4_ = 0x7f800000;
          auVar152._0_8_ = 0x7f8000007f800000;
          auVar152._12_4_ = 0x7f800000;
          auVar152._16_4_ = 0x7f800000;
          auVar152._20_4_ = 0x7f800000;
          auVar152._24_4_ = 0x7f800000;
          auVar152._28_4_ = 0x7f800000;
          auVar96 = vblendmps_avx512vl(auVar152,local_3a0);
          auVar131._0_4_ =
               (uint)(bVar59 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar59 & 1) * 0x7f800000;
          bVar61 = (bool)(bVar59 >> 1 & 1);
          auVar131._4_4_ = (uint)bVar61 * auVar96._4_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)(bVar59 >> 2 & 1);
          auVar131._8_4_ = (uint)bVar61 * auVar96._8_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)(bVar59 >> 3 & 1);
          auVar131._12_4_ = (uint)bVar61 * auVar96._12_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)(bVar59 >> 4 & 1);
          auVar131._16_4_ = (uint)bVar61 * auVar96._16_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)(bVar59 >> 5 & 1);
          auVar131._20_4_ = (uint)bVar61 * auVar96._20_4_ | (uint)!bVar61 * 0x7f800000;
          bVar61 = (bool)(bVar59 >> 6 & 1);
          auVar131._24_4_ = (uint)bVar61 * auVar96._24_4_ | (uint)!bVar61 * 0x7f800000;
          auVar131._28_4_ =
               (uint)(bVar59 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar59 >> 7) * 0x7f800000;
          auVar96 = vshufps_avx(auVar131,auVar131,0xb1);
          auVar96 = vminps_avx(auVar131,auVar96);
          auVar100 = vshufpd_avx(auVar96,auVar96,5);
          auVar96 = vminps_avx(auVar96,auVar100);
          auVar100 = vpermpd_avx2(auVar96,0x4e);
          auVar96 = vminps_avx(auVar96,auVar100);
          uVar26 = vcmpps_avx512vl(auVar131,auVar96,0);
          bVar55 = (byte)uVar26 & bVar59;
          bVar57 = bVar59;
          if (bVar55 != 0) {
            bVar57 = bVar55;
          }
          iVar2 = 0;
          for (uVar65 = (uint)bVar57; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
            iVar2 = iVar2 + 1;
          }
          uVar65 = *(uint *)(local_1c0 + (uint)(iVar2 << 2));
          fVar171 = local_884;
          fVar153 = *(float *)(local_2a0 + (uint)(iVar2 << 2));
          uVar154 = 0;
          uVar246 = 0;
          uVar247 = 0;
          if ((float)local_6e0._0_4_ < 0.0) {
            local_7e0._0_16_ = ZEXT416((uint)*(float *)(local_2a0 + (uint)(iVar2 << 2)));
            local_860[1] = 0;
            local_860[0] = bVar59;
            local_860._2_30_ = auVar98._2_30_;
            auVar254 = ZEXT1664(auVar254._0_16_);
            fVar171 = sqrtf((float)local_6e0._0_4_);
            bVar59 = local_860[0];
            auVar258 = ZEXT3264(local_880);
            auVar98 = vmovdqa64_avx512vl(auVar88);
            auVar256 = ZEXT3264(auVar98);
            auVar98 = vmovdqa64_avx512vl(auVar87);
            auVar255 = ZEXT3264(auVar98);
            auVar234 = ZEXT3264(local_760);
            auVar260 = ZEXT3264(local_800);
            auVar239 = ZEXT3264(local_7a0);
            auVar237 = ZEXT3264(local_740);
            auVar243 = ZEXT3264(local_780);
            fVar153 = (float)local_7e0._0_4_;
            uVar154 = local_7e0._4_4_;
            uVar246 = local_7e0._8_4_;
            uVar247 = local_7e0._12_4_;
          }
          auVar217 = ZEXT464(uVar65);
          auVar83 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar84 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar85 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar79 = vminps_avx(auVar83,auVar85);
          auVar83 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar85 = vmaxps_avx(auVar84,auVar83);
          auVar206._8_4_ = 0x7fffffff;
          auVar206._0_8_ = 0x7fffffff7fffffff;
          auVar206._12_4_ = 0x7fffffff;
          auVar84 = vandps_avx(auVar79,auVar206);
          auVar83 = vandps_avx(auVar85,auVar206);
          auVar84 = vmaxps_avx(auVar84,auVar83);
          auVar83 = vmovshdup_avx(auVar84);
          auVar83 = vmaxss_avx(auVar83,auVar84);
          auVar84 = vshufpd_avx(auVar84,auVar84,1);
          auVar84 = vmaxss_avx(auVar84,auVar83);
          local_540._0_4_ = auVar84._0_4_ * 1.9073486e-06;
          local_7c0._0_4_ = fVar171 * 1.9073486e-06;
          local_610 = vshufps_avx(auVar85,auVar85,0xff);
          lVar60 = 5;
          do {
            do {
              auVar98 = local_7e0;
              bVar61 = lVar60 == 0;
              lVar60 = lVar60 + -1;
              if (bVar61) goto LAB_0190a092;
              auVar144._4_4_ = fVar153;
              auVar144._0_4_ = fVar153;
              auVar144._8_4_ = fVar153;
              auVar144._12_4_ = fVar153;
              auVar83 = vfmadd132ps_fma(auVar144,ZEXT816(0) << 0x40,local_6d0);
              fVar172 = auVar217._0_4_;
              fVar171 = 1.0 - fVar172;
              auVar188._0_4_ = local_5a0._0_4_ * fVar172;
              auVar188._4_4_ = local_5a0._4_4_ * fVar172;
              auVar188._8_4_ = local_5a0._8_4_ * fVar172;
              auVar188._12_4_ = local_5a0._12_4_ * fVar172;
              local_4c0._0_16_ = ZEXT416((uint)fVar171);
              auVar207._4_4_ = fVar171;
              auVar207._0_4_ = fVar171;
              auVar207._8_4_ = fVar171;
              auVar207._12_4_ = fVar171;
              auVar84 = vfmadd231ps_fma(auVar188,auVar207,local_560._0_16_);
              auVar213._0_4_ = local_580._0_4_ * fVar172;
              auVar213._4_4_ = local_580._4_4_ * fVar172;
              auVar213._8_4_ = local_580._8_4_ * fVar172;
              auVar213._12_4_ = local_580._12_4_ * fVar172;
              auVar85 = vfmadd231ps_fma(auVar213,auVar207,local_5a0._0_16_);
              auVar223._0_4_ = fVar172 * (float)local_5c0._0_4_;
              auVar223._4_4_ = fVar172 * (float)local_5c0._4_4_;
              auVar223._8_4_ = fVar172 * fStack_5b8;
              auVar223._12_4_ = fVar172 * fStack_5b4;
              auVar79 = vfmadd231ps_fma(auVar223,auVar207,local_580._0_16_);
              auVar231._0_4_ = fVar172 * auVar85._0_4_;
              auVar231._4_4_ = fVar172 * auVar85._4_4_;
              auVar231._8_4_ = fVar172 * auVar85._8_4_;
              auVar231._12_4_ = fVar172 * auVar85._12_4_;
              auVar84 = vfmadd231ps_fma(auVar231,auVar207,auVar84);
              auVar189._0_4_ = fVar172 * auVar79._0_4_;
              auVar189._4_4_ = fVar172 * auVar79._4_4_;
              auVar189._8_4_ = fVar172 * auVar79._8_4_;
              auVar189._12_4_ = fVar172 * auVar79._12_4_;
              auVar85 = vfmadd231ps_fma(auVar189,auVar207,auVar85);
              auVar214._0_4_ = fVar172 * auVar85._0_4_;
              auVar214._4_4_ = fVar172 * auVar85._4_4_;
              auVar214._8_4_ = fVar172 * auVar85._8_4_;
              auVar214._12_4_ = fVar172 * auVar85._12_4_;
              auVar79 = vfmadd231ps_fma(auVar214,auVar84,auVar207);
              auVar84 = vsubps_avx(auVar85,auVar84);
              auVar35._8_4_ = 0x40400000;
              auVar35._0_8_ = 0x4040000040400000;
              auVar35._12_4_ = 0x40400000;
              auVar85 = vmulps_avx512vl(auVar84,auVar35);
              _local_4a0 = auVar79;
              auVar83 = vsubps_avx(auVar83,auVar79);
              auVar84 = vdpps_avx(auVar83,auVar83,0x7f);
              local_7e0._4_4_ = uVar154;
              local_7e0._0_4_ = fVar153;
              local_7e0._8_4_ = uVar246;
              local_7e0._16_16_ = auVar98._16_16_;
              local_7e0._12_4_ = uVar247;
              local_860._0_16_ = auVar85;
              local_700._0_16_ = auVar83;
              local_720._0_16_ = auVar84;
              if (auVar84._0_4_ < 0.0) {
                auVar237._0_4_ = sqrtf(auVar84._0_4_);
                auVar237._4_60_ = extraout_var_01;
                auVar84 = auVar237._0_16_;
                auVar85 = local_860._0_16_;
              }
              else {
                auVar84 = vsqrtss_avx(auVar84,auVar84);
              }
              local_4e0._0_16_ = vdpps_avx(auVar85,auVar85,0x7f);
              fVar153 = local_4e0._0_4_;
              auVar190._4_12_ = ZEXT812(0) << 0x20;
              auVar190._0_4_ = fVar153;
              local_660._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar190);
              fVar171 = local_660._0_4_;
              local_500._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar190);
              auVar36._8_4_ = 0x80000000;
              auVar36._0_8_ = 0x8000000080000000;
              auVar36._12_4_ = 0x80000000;
              auVar79 = vxorps_avx512vl(local_4e0._0_16_,auVar36);
              auVar83 = vfnmadd213ss_fma(local_500._0_16_,local_4e0._0_16_,ZEXT416(0x40000000));
              local_520._0_4_ = auVar83._0_4_;
              local_640._0_4_ = auVar84._0_4_;
              if (fVar153 < auVar79._0_4_) {
                auVar239._0_4_ = sqrtf(fVar153);
                auVar239._4_60_ = extraout_var_02;
                auVar84 = ZEXT416((uint)local_640._0_4_);
                auVar83 = auVar239._0_16_;
                auVar85 = local_860._0_16_;
              }
              else {
                auVar83 = vsqrtss_avx512f(local_4e0._0_16_,local_4e0._0_16_);
              }
              fVar173 = local_660._0_4_;
              fVar153 = fVar171 * 1.5 + fVar153 * -0.5 * fVar173 * fVar173 * fVar173;
              auVar251._0_4_ = auVar85._0_4_ * fVar153;
              auVar251._4_4_ = auVar85._4_4_ * fVar153;
              auVar251._8_4_ = auVar85._8_4_ * fVar153;
              auVar251._12_4_ = auVar85._12_4_ * fVar153;
              local_660._0_16_ = vdpps_avx(local_700._0_16_,auVar251,0x7f);
              auVar76 = vaddss_avx512f(auVar84,ZEXT416(0x3f800000));
              auVar145._0_4_ = local_660._0_4_ * local_660._0_4_;
              auVar145._4_4_ = local_660._4_4_ * local_660._4_4_;
              auVar145._8_4_ = local_660._8_4_ * local_660._8_4_;
              auVar145._12_4_ = local_660._12_4_ * local_660._12_4_;
              auVar79 = vsubps_avx(local_720._0_16_,auVar145);
              fVar171 = auVar79._0_4_;
              auVar163._4_12_ = ZEXT812(0) << 0x20;
              auVar163._0_4_ = fVar171;
              auVar86 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar163);
              auVar75 = vmulss_avx512f(auVar86,ZEXT416(0x3fc00000));
              auVar72 = vmulss_avx512f(auVar79,ZEXT416(0xbf000000));
              uVar63 = fVar171 == 0.0;
              uVar62 = fVar171 < 0.0;
              if ((bool)uVar62) {
                local_600 = fVar153;
                fStack_5fc = fVar153;
                fStack_5f8 = fVar153;
                fStack_5f4 = fVar153;
                local_5f0 = auVar251;
                local_5e0 = auVar86;
                fVar171 = sqrtf(fVar171);
                auVar72 = ZEXT416(auVar72._0_4_);
                auVar75 = ZEXT416(auVar75._0_4_);
                auVar83 = ZEXT416(auVar83._0_4_);
                auVar84 = ZEXT416((uint)local_640._0_4_);
                auVar76 = ZEXT416(auVar76._0_4_);
                auVar251 = local_5f0;
                auVar85 = local_860._0_16_;
                auVar86 = local_5e0;
                fVar153 = local_600;
                fVar173 = fStack_5fc;
                fVar175 = fStack_5f8;
                fVar174 = fStack_5f4;
              }
              else {
                auVar79 = vsqrtss_avx(auVar79,auVar79);
                fVar171 = auVar79._0_4_;
                fVar173 = fVar153;
                fVar175 = fVar153;
                fVar174 = fVar153;
              }
              auVar254 = ZEXT1664(local_720._0_16_);
              auVar243 = ZEXT3264(local_780);
              auVar239 = ZEXT3264(local_7a0);
              auVar260 = ZEXT3264(local_800);
              auVar98 = vmovdqa64_avx512vl(auVar87);
              auVar255 = ZEXT3264(auVar98);
              auVar98 = vmovdqa64_avx512vl(auVar88);
              auVar256 = ZEXT3264(auVar98);
              auVar258 = ZEXT3264(local_880);
              auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar217._0_16_,
                                        local_4c0._0_16_);
              fVar176 = auVar79._0_4_ * 6.0;
              fVar177 = fVar172 * 6.0;
              auVar191._0_4_ = fVar177 * (float)local_5c0._0_4_;
              auVar191._4_4_ = fVar177 * (float)local_5c0._4_4_;
              auVar191._8_4_ = fVar177 * fStack_5b8;
              auVar191._12_4_ = fVar177 * fStack_5b4;
              auVar164._4_4_ = fVar176;
              auVar164._0_4_ = fVar176;
              auVar164._8_4_ = fVar176;
              auVar164._12_4_ = fVar176;
              auVar79 = vfmadd132ps_fma(auVar164,auVar191,local_580._0_16_);
              auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4c0._0_16_,
                                        auVar217._0_16_);
              fVar176 = auVar73._0_4_ * 6.0;
              auVar192._4_4_ = fVar176;
              auVar192._0_4_ = fVar176;
              auVar192._8_4_ = fVar176;
              auVar192._12_4_ = fVar176;
              auVar79 = vfmadd132ps_fma(auVar192,auVar79,local_5a0._0_16_);
              fVar176 = local_4c0._0_4_ * 6.0;
              auVar165._4_4_ = fVar176;
              auVar165._0_4_ = fVar176;
              auVar165._8_4_ = fVar176;
              auVar165._12_4_ = fVar176;
              auVar79 = vfmadd132ps_fma(auVar165,auVar79,local_560._0_16_);
              auVar193._0_4_ = auVar79._0_4_ * (float)local_4e0._0_4_;
              auVar193._4_4_ = auVar79._4_4_ * (float)local_4e0._0_4_;
              auVar193._8_4_ = auVar79._8_4_ * (float)local_4e0._0_4_;
              auVar193._12_4_ = auVar79._12_4_ * (float)local_4e0._0_4_;
              auVar79 = vdpps_avx(auVar85,auVar79,0x7f);
              fVar176 = auVar79._0_4_;
              auVar166._0_4_ = auVar85._0_4_ * fVar176;
              auVar166._4_4_ = auVar85._4_4_ * fVar176;
              auVar166._8_4_ = auVar85._8_4_ * fVar176;
              auVar166._12_4_ = auVar85._12_4_ * fVar176;
              auVar79 = vsubps_avx(auVar193,auVar166);
              fVar176 = (float)local_520._0_4_ * (float)local_500._0_4_;
              auVar37._8_4_ = 0x80000000;
              auVar37._0_8_ = 0x8000000080000000;
              auVar37._12_4_ = 0x80000000;
              auVar74 = vxorps_avx512vl(auVar85,auVar37);
              auVar215._0_4_ = fVar153 * auVar79._0_4_ * fVar176;
              auVar215._4_4_ = fVar173 * auVar79._4_4_ * fVar176;
              auVar215._8_4_ = fVar175 * auVar79._8_4_ * fVar176;
              auVar215._12_4_ = fVar174 * auVar79._12_4_ * fVar176;
              auVar79 = vdpps_avx(auVar74,auVar251,0x7f);
              auVar73 = vmaxss_avx(ZEXT416((uint)local_540._0_4_),
                                   ZEXT416((uint)((float)local_7e0._0_4_ * (float)local_7c0._0_4_)))
              ;
              auVar77 = vdivss_avx512f(ZEXT416((uint)local_540._0_4_),auVar83);
              auVar83 = vdpps_avx(local_700._0_16_,auVar215,0x7f);
              auVar84 = vfmadd213ss_fma(auVar84,ZEXT416((uint)local_540._0_4_),auVar73);
              vfmadd213ss_avx512f(auVar76,auVar77,auVar84);
              auVar84 = vdpps_avx(local_6d0,auVar251,0x7f);
              fVar153 = auVar79._0_4_ + auVar83._0_4_;
              auVar83 = vdpps_avx(local_700._0_16_,auVar74,0x7f);
              auVar76 = vmulss_avx512f(auVar72,auVar86);
              auVar86 = vmulss_avx512f(auVar86,auVar86);
              auVar79 = vdpps_avx(local_700._0_16_,local_6d0,0x7f);
              auVar86 = vaddss_avx512f(auVar75,ZEXT416((uint)(auVar76._0_4_ * auVar86._0_4_)));
              auVar76 = vfnmadd231ss_avx512f(auVar83,local_660._0_16_,ZEXT416((uint)fVar153));
              auVar75 = vfnmadd231ss_avx512f(auVar79,local_660._0_16_,auVar84);
              auVar83 = vpermilps_avx(_local_4a0,0xff);
              fVar171 = fVar171 - auVar83._0_4_;
              auVar83 = vshufps_avx(auVar85,auVar85,0xff);
              auVar79 = vfmsub213ss_fma(auVar76,auVar86,auVar83);
              fVar173 = auVar75._0_4_ * auVar86._0_4_;
              auVar86 = vfmsub231ss_fma(ZEXT416((uint)(auVar84._0_4_ * auVar79._0_4_)),
                                        ZEXT416((uint)fVar153),ZEXT416((uint)fVar173));
              fVar175 = auVar86._0_4_;
              auVar232._0_4_ = fVar173 / fVar175;
              auVar232._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar224._0_4_ = auVar79._0_4_ / fVar175;
              auVar224._4_12_ = auVar79._4_12_;
              auVar79 = vmulss_avx512f(local_660._0_16_,auVar232);
              auVar86 = vmulss_avx512f(local_660._0_16_,auVar224);
              fVar172 = fVar172 - (auVar79._0_4_ - fVar171 * (auVar84._0_4_ / fVar175));
              auVar217 = ZEXT464((uint)fVar172);
              fVar153 = (float)local_7e0._0_4_ - (fVar171 * (fVar153 / fVar175) - auVar86._0_4_);
              uVar154 = 0;
              uVar246 = 0;
              uVar247 = 0;
              auVar38._8_4_ = 0x7fffffff;
              auVar38._0_8_ = 0x7fffffff7fffffff;
              auVar38._12_4_ = 0x7fffffff;
              auVar84 = vandps_avx512vl(local_660._0_16_,auVar38);
              auVar84 = vucomiss_avx512f(auVar84);
              auVar237 = ZEXT3264(local_740);
              auVar234 = ZEXT3264(local_760);
            } while ((bool)uVar62 || (bool)uVar63);
            auVar84 = vaddss_avx512f(auVar73,auVar84);
            auVar84 = vfmadd231ss_fma(auVar84,local_610,ZEXT416(0x36000000));
            auVar39._8_4_ = 0x7fffffff;
            auVar39._0_8_ = 0x7fffffff7fffffff;
            auVar39._12_4_ = 0x7fffffff;
            auVar79 = vandps_avx512vl(ZEXT416((uint)fVar171),auVar39);
          } while (auVar84._0_4_ <= auVar79._0_4_);
          fVar153 = fVar153 + (float)local_620._0_4_;
          if ((((fVar6 <= fVar153) && (fVar171 = *(float *)(ray + k * 4 + 0x80), fVar153 <= fVar171)
               ) && (0.0 <= fVar172)) && (fVar172 <= 1.0)) {
            auVar194._4_12_ = SUB1612(ZEXT816(0),0);
            auVar194._0_4_ = local_720._0_4_;
            auVar84 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar194);
            fVar173 = auVar84._0_4_;
            pGVar8 = (context->scene->geometries).items[uVar7].ptr;
            if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar173 = fVar173 * 1.5 + local_720._0_4_ * -0.5 * fVar173 * fVar173 * fVar173;
              auVar195._0_4_ = local_700._0_4_ * fVar173;
              auVar195._4_4_ = local_700._4_4_ * fVar173;
              auVar195._8_4_ = local_700._8_4_ * fVar173;
              auVar195._12_4_ = local_700._12_4_ * fVar173;
              auVar79 = vfmadd213ps_fma(auVar83,auVar195,auVar85);
              auVar84 = vshufps_avx(auVar195,auVar195,0xc9);
              auVar83 = vshufps_avx(auVar85,auVar85,0xc9);
              auVar196._0_4_ = auVar195._0_4_ * auVar83._0_4_;
              auVar196._4_4_ = auVar195._4_4_ * auVar83._4_4_;
              auVar196._8_4_ = auVar195._8_4_ * auVar83._8_4_;
              auVar196._12_4_ = auVar195._12_4_ * auVar83._12_4_;
              auVar85 = vfmsub231ps_fma(auVar196,auVar85,auVar84);
              auVar84 = vshufps_avx(auVar85,auVar85,0xc9);
              auVar83 = vshufps_avx(auVar79,auVar79,0xc9);
              auVar85 = vshufps_avx(auVar85,auVar85,0xd2);
              auVar146._0_4_ = auVar79._0_4_ * auVar85._0_4_;
              auVar146._4_4_ = auVar79._4_4_ * auVar85._4_4_;
              auVar146._8_4_ = auVar79._8_4_ * auVar85._8_4_;
              auVar146._12_4_ = auVar79._12_4_ * auVar85._12_4_;
              auVar84 = vfmsub231ps_fma(auVar146,auVar84,auVar83);
              uVar154 = auVar84._0_4_;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                *(float *)(ray + k * 4 + 0x80) = fVar153;
                uVar246 = vextractps_avx(auVar84,1);
                *(undefined4 *)(ray + k * 4 + 0xc0) = uVar246;
                uVar246 = vextractps_avx(auVar84,2);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar246;
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar154;
                *(float *)(ray + k * 4 + 0xf0) = fVar172;
                *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                *(int *)(ray + k * 4 + 0x110) = (int)local_7a8;
                *(uint *)(ray + k * 4 + 0x120) = uVar7;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_440 = (RTCHitN  [16])vshufps_avx(auVar84,auVar84,0x55);
                auStack_430 = vshufps_avx(auVar84,auVar84,0xaa);
                local_420 = uVar154;
                uStack_41c = uVar154;
                uStack_418 = uVar154;
                uStack_414 = uVar154;
                local_410 = fVar172;
                fStack_40c = fVar172;
                fStack_408 = fVar172;
                fStack_404 = fVar172;
                local_400 = ZEXT416(0) << 0x20;
                local_3f0 = local_460._0_8_;
                uStack_3e8 = local_460._8_8_;
                local_3e0 = local_450;
                vpcmpeqd_avx2(ZEXT1632(local_450),ZEXT1632(local_450));
                uStack_3cc = context->user->instID[0];
                local_3d0 = uStack_3cc;
                uStack_3c8 = uStack_3cc;
                uStack_3c4 = uStack_3cc;
                uStack_3c0 = context->user->instPrimID[0];
                uStack_3bc = uStack_3c0;
                uStack_3b8 = uStack_3c0;
                uStack_3b4 = uStack_3c0;
                *(float *)(ray + k * 4 + 0x80) = fVar153;
                local_8a0 = local_470;
                local_830.valid = (int *)local_8a0;
                local_830.geometryUserPtr = pGVar8->userPtr;
                local_830.context = context->user;
                local_830.hit = local_440;
                local_830.N = 4;
                local_830.ray = (RTCRayN *)ray;
                if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar254 = ZEXT1664(local_720._0_16_);
                  (*pGVar8->intersectionFilterN)(&local_830);
                  auVar258 = ZEXT3264(local_880);
                  auVar98 = vmovdqa64_avx512vl(auVar88);
                  auVar256 = ZEXT3264(auVar98);
                  auVar98 = vmovdqa64_avx512vl(auVar87);
                  auVar255 = ZEXT3264(auVar98);
                  auVar234 = ZEXT3264(local_760);
                  auVar260 = ZEXT3264(local_800);
                  auVar239 = ZEXT3264(local_7a0);
                  auVar237 = ZEXT3264(local_740);
                  auVar243 = ZEXT3264(local_780);
                }
                uVar64 = vptestmd_avx512vl(local_8a0,local_8a0);
                if ((uVar64 & 0xf) != 0) {
                  p_Var13 = context->args->filter;
                  if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar254 = ZEXT1664(auVar254._0_16_);
                    (*p_Var13)(&local_830);
                    auVar258 = ZEXT3264(local_880);
                    auVar98 = vmovdqa64_avx512vl(auVar88);
                    auVar256 = ZEXT3264(auVar98);
                    auVar98 = vmovdqa64_avx512vl(auVar87);
                    auVar255 = ZEXT3264(auVar98);
                    auVar234 = ZEXT3264(local_760);
                    auVar260 = ZEXT3264(local_800);
                    auVar239 = ZEXT3264(local_7a0);
                    auVar237 = ZEXT3264(local_740);
                    auVar243 = ZEXT3264(local_780);
                  }
                  uVar64 = vptestmd_avx512vl(local_8a0,local_8a0);
                  uVar64 = uVar64 & 0xf;
                  bVar57 = (byte)uVar64;
                  if (bVar57 != 0) {
                    iVar3 = *(int *)(local_830.hit + 4);
                    iVar4 = *(int *)(local_830.hit + 8);
                    iVar1 = *(int *)(local_830.hit + 0xc);
                    bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
                    bVar15 = SUB81(uVar64 >> 3,0);
                    *(uint *)(local_830.ray + 0xc0) =
                         (uint)(bVar57 & 1) * *(int *)local_830.hit |
                         (uint)!(bool)(bVar57 & 1) * *(int *)(local_830.ray + 0xc0);
                    *(uint *)(local_830.ray + 0xc4) =
                         (uint)bVar61 * iVar3 | (uint)!bVar61 * *(int *)(local_830.ray + 0xc4);
                    *(uint *)(local_830.ray + 200) =
                         (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_830.ray + 200);
                    *(uint *)(local_830.ray + 0xcc) =
                         (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_830.ray + 0xcc);
                    iVar3 = *(int *)(local_830.hit + 0x14);
                    iVar4 = *(int *)(local_830.hit + 0x18);
                    iVar1 = *(int *)(local_830.hit + 0x1c);
                    bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
                    bVar15 = SUB81(uVar64 >> 3,0);
                    *(uint *)(local_830.ray + 0xd0) =
                         (uint)(bVar57 & 1) * *(int *)(local_830.hit + 0x10) |
                         (uint)!(bool)(bVar57 & 1) * *(int *)(local_830.ray + 0xd0);
                    *(uint *)(local_830.ray + 0xd4) =
                         (uint)bVar61 * iVar3 | (uint)!bVar61 * *(int *)(local_830.ray + 0xd4);
                    *(uint *)(local_830.ray + 0xd8) =
                         (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_830.ray + 0xd8);
                    *(uint *)(local_830.ray + 0xdc) =
                         (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_830.ray + 0xdc);
                    iVar3 = *(int *)(local_830.hit + 0x24);
                    iVar4 = *(int *)(local_830.hit + 0x28);
                    iVar1 = *(int *)(local_830.hit + 0x2c);
                    bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
                    bVar15 = SUB81(uVar64 >> 3,0);
                    *(uint *)(local_830.ray + 0xe0) =
                         (uint)(bVar57 & 1) * *(int *)(local_830.hit + 0x20) |
                         (uint)!(bool)(bVar57 & 1) * *(int *)(local_830.ray + 0xe0);
                    *(uint *)(local_830.ray + 0xe4) =
                         (uint)bVar61 * iVar3 | (uint)!bVar61 * *(int *)(local_830.ray + 0xe4);
                    *(uint *)(local_830.ray + 0xe8) =
                         (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_830.ray + 0xe8);
                    *(uint *)(local_830.ray + 0xec) =
                         (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_830.ray + 0xec);
                    iVar3 = *(int *)(local_830.hit + 0x34);
                    iVar4 = *(int *)(local_830.hit + 0x38);
                    iVar1 = *(int *)(local_830.hit + 0x3c);
                    bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
                    bVar15 = SUB81(uVar64 >> 3,0);
                    *(uint *)(local_830.ray + 0xf0) =
                         (uint)(bVar57 & 1) * *(int *)(local_830.hit + 0x30) |
                         (uint)!(bool)(bVar57 & 1) * *(int *)(local_830.ray + 0xf0);
                    *(uint *)(local_830.ray + 0xf4) =
                         (uint)bVar61 * iVar3 | (uint)!bVar61 * *(int *)(local_830.ray + 0xf4);
                    *(uint *)(local_830.ray + 0xf8) =
                         (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_830.ray + 0xf8);
                    *(uint *)(local_830.ray + 0xfc) =
                         (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_830.ray + 0xfc);
                    iVar3 = *(int *)(local_830.hit + 0x44);
                    iVar4 = *(int *)(local_830.hit + 0x48);
                    iVar1 = *(int *)(local_830.hit + 0x4c);
                    bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
                    bVar15 = SUB81(uVar64 >> 3,0);
                    *(uint *)(local_830.ray + 0x100) =
                         (uint)(bVar57 & 1) * *(int *)(local_830.hit + 0x40) |
                         (uint)!(bool)(bVar57 & 1) * *(int *)(local_830.ray + 0x100);
                    *(uint *)(local_830.ray + 0x104) =
                         (uint)bVar61 * iVar3 | (uint)!bVar61 * *(int *)(local_830.ray + 0x104);
                    *(uint *)(local_830.ray + 0x108) =
                         (uint)bVar14 * iVar4 | (uint)!bVar14 * *(int *)(local_830.ray + 0x108);
                    *(uint *)(local_830.ray + 0x10c) =
                         (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_830.ray + 0x10c);
                    auVar84 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_830.hit + 0x50));
                    *(undefined1 (*) [16])(local_830.ray + 0x110) = auVar84;
                    auVar84 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_830.hit + 0x60));
                    *(undefined1 (*) [16])(local_830.ray + 0x120) = auVar84;
                    auVar84 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_830.hit + 0x70));
                    *(undefined1 (*) [16])(local_830.ray + 0x130) = auVar84;
                    auVar84 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_830.hit + 0x80));
                    *(undefined1 (*) [16])(local_830.ray + 0x140) = auVar84;
                    goto LAB_0190a092;
                  }
                }
                *(float *)(ray + k * 4 + 0x80) = fVar171;
              }
            }
          }
LAB_0190a092:
          uVar154 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar226._4_4_ = uVar154;
          auVar226._0_4_ = uVar154;
          auVar226._8_4_ = uVar154;
          auVar226._12_4_ = uVar154;
          auVar226._16_4_ = uVar154;
          auVar226._20_4_ = uVar154;
          auVar226._24_4_ = uVar154;
          auVar226._28_4_ = uVar154;
          auVar227 = ZEXT3264(auVar226);
          auVar53._4_4_ = fStack_33c;
          auVar53._0_4_ = local_340;
          auVar53._8_4_ = fStack_338;
          auVar53._12_4_ = fStack_334;
          auVar53._16_4_ = fStack_330;
          auVar53._20_4_ = fStack_32c;
          auVar53._24_4_ = fStack_328;
          auVar53._28_4_ = fStack_324;
          uVar26 = vcmpps_avx512vl(auVar226,auVar53,0xd);
          auVar257 = ZEXT3264(local_6a0);
          auVar259 = ZEXT3264(local_6c0);
        }
        uVar29 = vpcmpd_avx512vl(local_300,local_280,1);
        uVar28 = vpcmpd_avx512vl(local_300,_local_360,1);
        auVar170._0_4_ = (float)local_380._0_4_ + (float)local_200._0_4_;
        auVar170._4_4_ = (float)local_380._4_4_ + (float)local_200._4_4_;
        auVar170._8_4_ = fStack_378 + fStack_1f8;
        auVar170._12_4_ = fStack_374 + fStack_1f4;
        auVar170._16_4_ = fStack_370 + fStack_1f0;
        auVar170._20_4_ = fStack_36c + fStack_1ec;
        auVar170._24_4_ = fStack_368 + fStack_1e8;
        auVar170._28_4_ = fStack_364 + fStack_1e4;
        uVar154 = auVar227._0_4_;
        auVar200._4_4_ = uVar154;
        auVar200._0_4_ = uVar154;
        auVar200._8_4_ = uVar154;
        auVar200._12_4_ = uVar154;
        auVar200._16_4_ = uVar154;
        auVar200._20_4_ = uVar154;
        auVar200._24_4_ = uVar154;
        auVar200._28_4_ = uVar154;
        uVar26 = vcmpps_avx512vl(auVar170,auVar200,2);
        bVar59 = (byte)local_88c & (byte)uVar29 & (byte)uVar26;
        auVar208._0_4_ = (float)local_380._0_4_ + (float)local_2c0._0_4_;
        auVar208._4_4_ = (float)local_380._4_4_ + (float)local_2c0._4_4_;
        auVar208._8_4_ = fStack_378 + fStack_2b8;
        auVar208._12_4_ = fStack_374 + fStack_2b4;
        auVar208._16_4_ = fStack_370 + fStack_2b0;
        auVar208._20_4_ = fStack_36c + fStack_2ac;
        auVar208._24_4_ = fStack_368 + fStack_2a8;
        auVar208._28_4_ = fStack_364 + fStack_2a4;
        uVar26 = vcmpps_avx512vl(auVar208,auVar200,2);
        bVar54 = bVar54 & (byte)uVar28 & (byte)uVar26 | bVar59;
        if (bVar54 != 0) {
          abStack_180[uVar56 * 0x60] = bVar54;
          bVar61 = (bool)(bVar59 >> 1 & 1);
          bVar14 = (bool)(bVar59 >> 2 & 1);
          bVar15 = (bool)(bVar59 >> 3 & 1);
          bVar16 = (bool)(bVar59 >> 4 & 1);
          bVar17 = (bool)(bVar59 >> 5 & 1);
          bVar18 = (bool)(bVar59 >> 6 & 1);
          auStack_160[uVar56 * 0x18] =
               (uint)(bVar59 & 1) * local_200._0_4_ | (uint)!(bool)(bVar59 & 1) * local_2c0._0_4_;
          auStack_160[uVar56 * 0x18 + 1] =
               (uint)bVar61 * local_200._4_4_ | (uint)!bVar61 * local_2c0._4_4_;
          auStack_160[uVar56 * 0x18 + 2] =
               (uint)bVar14 * (int)fStack_1f8 | (uint)!bVar14 * (int)fStack_2b8;
          auStack_160[uVar56 * 0x18 + 3] =
               (uint)bVar15 * (int)fStack_1f4 | (uint)!bVar15 * (int)fStack_2b4;
          auStack_160[uVar56 * 0x18 + 4] =
               (uint)bVar16 * (int)fStack_1f0 | (uint)!bVar16 * (int)fStack_2b0;
          auStack_160[uVar56 * 0x18 + 5] =
               (uint)bVar17 * (int)fStack_1ec | (uint)!bVar17 * (int)fStack_2ac;
          auStack_160[uVar56 * 0x18 + 6] =
               (uint)bVar18 * (int)fStack_1e8 | (uint)!bVar18 * (int)fStack_2a8;
          auStack_160[uVar56 * 0x18 + 7] =
               (uint)(bVar59 >> 7) * (int)fStack_1e4 | (uint)!(bool)(bVar59 >> 7) * (int)fStack_2a4;
          uVar64 = vmovlps_avx(local_310);
          (&uStack_140)[uVar56 * 0xc] = uVar64;
          aiStack_138[uVar56 * 0x18] = local_a18 + 1;
          uVar56 = (ulong)((int)uVar56 + 1);
        }
        auVar227 = ZEXT3264(_DAT_01f7b040);
        prim = local_7b0;
      }
    }
    do {
      uVar65 = (uint)uVar56;
      uVar56 = (ulong)(uVar65 - 1);
      if (uVar65 == 0) {
        uVar154 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar40._4_4_ = uVar154;
        auVar40._0_4_ = uVar154;
        auVar40._8_4_ = uVar154;
        auVar40._12_4_ = uVar154;
        uVar26 = vcmpps_avx512vl(local_320,auVar40,2);
        local_5c8 = (ulong)((uint)uVar26 & (uint)local_5c8 - 1 & (uint)local_5c8);
        goto LAB_01907b2d;
      }
      auVar98 = *(undefined1 (*) [32])(auStack_160 + uVar56 * 0x18);
      auVar167._0_4_ = auVar98._0_4_ + (float)local_380._0_4_;
      auVar167._4_4_ = auVar98._4_4_ + (float)local_380._4_4_;
      auVar167._8_4_ = auVar98._8_4_ + fStack_378;
      auVar167._12_4_ = auVar98._12_4_ + fStack_374;
      auVar167._16_4_ = auVar98._16_4_ + fStack_370;
      auVar167._20_4_ = auVar98._20_4_ + fStack_36c;
      auVar167._24_4_ = auVar98._24_4_ + fStack_368;
      auVar167._28_4_ = auVar98._28_4_ + fStack_364;
      uVar154 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar43._4_4_ = uVar154;
      auVar43._0_4_ = uVar154;
      auVar43._8_4_ = uVar154;
      auVar43._12_4_ = uVar154;
      auVar43._16_4_ = uVar154;
      auVar43._20_4_ = uVar154;
      auVar43._24_4_ = uVar154;
      auVar43._28_4_ = uVar154;
      uVar26 = vcmpps_avx512vl(auVar167,auVar43,2);
      uVar132 = (uint)uVar26 & (uint)abStack_180[uVar56 * 0x60];
    } while (uVar132 == 0);
    uVar64 = (&uStack_140)[uVar56 * 0xc];
    auVar158._8_8_ = 0;
    auVar158._0_8_ = uVar64;
    auVar199._8_4_ = 0x7f800000;
    auVar199._0_8_ = 0x7f8000007f800000;
    auVar199._12_4_ = 0x7f800000;
    auVar199._16_4_ = 0x7f800000;
    auVar199._20_4_ = 0x7f800000;
    auVar199._24_4_ = 0x7f800000;
    auVar199._28_4_ = 0x7f800000;
    auVar96 = vblendmps_avx512vl(auVar199,auVar98);
    bVar54 = (byte)uVar132;
    auVar129._0_4_ =
         (uint)(bVar54 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar54 & 1) * (int)auVar98._0_4_;
    bVar61 = (bool)((byte)(uVar132 >> 1) & 1);
    auVar129._4_4_ = (uint)bVar61 * auVar96._4_4_ | (uint)!bVar61 * (int)auVar98._4_4_;
    bVar61 = (bool)((byte)(uVar132 >> 2) & 1);
    auVar129._8_4_ = (uint)bVar61 * auVar96._8_4_ | (uint)!bVar61 * (int)auVar98._8_4_;
    bVar61 = (bool)((byte)(uVar132 >> 3) & 1);
    auVar129._12_4_ = (uint)bVar61 * auVar96._12_4_ | (uint)!bVar61 * (int)auVar98._12_4_;
    bVar61 = (bool)((byte)(uVar132 >> 4) & 1);
    auVar129._16_4_ = (uint)bVar61 * auVar96._16_4_ | (uint)!bVar61 * (int)auVar98._16_4_;
    bVar61 = (bool)((byte)(uVar132 >> 5) & 1);
    auVar129._20_4_ = (uint)bVar61 * auVar96._20_4_ | (uint)!bVar61 * (int)auVar98._20_4_;
    bVar61 = (bool)((byte)(uVar132 >> 6) & 1);
    auVar129._24_4_ = (uint)bVar61 * auVar96._24_4_ | (uint)!bVar61 * (int)auVar98._24_4_;
    auVar129._28_4_ =
         (uVar132 >> 7) * auVar96._28_4_ | (uint)!SUB41(uVar132 >> 7,0) * (int)auVar98._28_4_;
    auVar98 = vshufps_avx(auVar129,auVar129,0xb1);
    auVar98 = vminps_avx(auVar129,auVar98);
    auVar96 = vshufpd_avx(auVar98,auVar98,5);
    auVar98 = vminps_avx(auVar98,auVar96);
    auVar96 = vpermpd_avx2(auVar98,0x4e);
    auVar98 = vminps_avx(auVar98,auVar96);
    uVar26 = vcmpps_avx512vl(auVar129,auVar98,0);
    bVar59 = (byte)uVar26 & bVar54;
    if (bVar59 != 0) {
      uVar132 = (uint)bVar59;
    }
    uVar133 = 0;
    for (; (uVar132 & 1) == 0; uVar132 = uVar132 >> 1 | 0x80000000) {
      uVar133 = uVar133 + 1;
    }
    local_a18 = aiStack_138[uVar56 * 0x18];
    bVar54 = ~('\x01' << ((byte)uVar133 & 0x1f)) & bVar54;
    abStack_180[uVar56 * 0x60] = bVar54;
    if (bVar54 == 0) {
      uVar65 = uVar65 - 1;
    }
    uVar154 = (undefined4)uVar64;
    auVar147._4_4_ = uVar154;
    auVar147._0_4_ = uVar154;
    auVar147._8_4_ = uVar154;
    auVar147._12_4_ = uVar154;
    auVar147._16_4_ = uVar154;
    auVar147._20_4_ = uVar154;
    auVar147._24_4_ = uVar154;
    auVar147._28_4_ = uVar154;
    auVar84 = vmovshdup_avx(auVar158);
    auVar84 = vsubps_avx(auVar84,auVar158);
    auVar168._0_4_ = auVar84._0_4_;
    auVar168._4_4_ = auVar168._0_4_;
    auVar168._8_4_ = auVar168._0_4_;
    auVar168._12_4_ = auVar168._0_4_;
    auVar168._16_4_ = auVar168._0_4_;
    auVar168._20_4_ = auVar168._0_4_;
    auVar168._24_4_ = auVar168._0_4_;
    auVar168._28_4_ = auVar168._0_4_;
    auVar84 = vfmadd132ps_fma(auVar168,auVar147,auVar227._0_32_);
    _local_440 = ZEXT1632(auVar84);
    local_310._8_8_ = 0;
    local_310._0_8_ = *(ulong *)(local_440 + (ulong)uVar133 * 4);
    uVar56 = (ulong)uVar65;
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }